

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersector1<4>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  Primitive PVar12;
  int iVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  uint uVar26;
  long lVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [28];
  uint uVar110;
  uint uVar111;
  uint uVar112;
  ulong uVar113;
  ulong uVar114;
  Geometry *pGVar115;
  ulong uVar116;
  long lVar117;
  undefined4 uVar118;
  undefined8 uVar119;
  vint4 bi_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar136;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  vint4 bi_1;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar140 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar156 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 ai_2;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar175 [64];
  vint4 ai;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 bi;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  vint4 ai_1;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined4 uVar210;
  float fVar211;
  float fVar216;
  float fVar217;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar215 [64];
  float fVar222;
  float fVar227;
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar232;
  float fVar234;
  undefined1 auVar233 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_78c;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  ulong local_728;
  undefined1 local_720 [32];
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  Primitive *local_6c0;
  Precalculations *local_6b8;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  uint local_5b4;
  uint local_5b0;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [2] [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  int local_240;
  int local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar116 = (ulong)(byte)PVar12;
  fVar211 = *(float *)(prim + uVar116 * 0x19 + 0x12);
  auVar20 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar116 * 0x19 + 6));
  auVar120._0_4_ = fVar211 * auVar20._0_4_;
  auVar120._4_4_ = fVar211 * auVar20._4_4_;
  auVar120._8_4_ = fVar211 * auVar20._8_4_;
  auVar120._12_4_ = fVar211 * auVar20._12_4_;
  auVar184._0_4_ = fVar211 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar184._4_4_ = fVar211 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar184._8_4_ = fVar211 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar184._12_4_ = fVar211 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar116 * 4 + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar116 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar125 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar116 * 6 + 6)));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar116 * 0xb + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar12 * 0xc) + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar12 * 0xc + uVar116 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar113 = (ulong)(uint)((int)(uVar116 * 9) * 2);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 + 6)));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar122 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 + uVar116 + 6)));
  auVar122 = vcvtdq2ps_avx(auVar122);
  uVar113 = (ulong)(uint)((int)(uVar116 * 5) << 2);
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar228._4_4_ = auVar184._0_4_;
  auVar228._0_4_ = auVar184._0_4_;
  auVar228._8_4_ = auVar184._0_4_;
  auVar228._12_4_ = auVar184._0_4_;
  auVar138 = vshufps_avx(auVar184,auVar184,0x55);
  auVar121 = vshufps_avx(auVar184,auVar184,0xaa);
  fVar211 = auVar121._0_4_;
  auVar212._0_4_ = fVar211 * auVar125._0_4_;
  fVar216 = auVar121._4_4_;
  auVar212._4_4_ = fVar216 * auVar125._4_4_;
  fVar217 = auVar121._8_4_;
  auVar212._8_4_ = fVar217 * auVar125._8_4_;
  fVar218 = auVar121._12_4_;
  auVar212._12_4_ = fVar218 * auVar125._12_4_;
  auVar208._0_4_ = auVar19._0_4_ * fVar211;
  auVar208._4_4_ = auVar19._4_4_ * fVar216;
  auVar208._8_4_ = auVar19._8_4_ * fVar217;
  auVar208._12_4_ = auVar19._12_4_ * fVar218;
  auVar197._0_4_ = auVar155._0_4_ * fVar211;
  auVar197._4_4_ = auVar155._4_4_ * fVar216;
  auVar197._8_4_ = auVar155._8_4_ * fVar217;
  auVar197._12_4_ = auVar155._12_4_ * fVar218;
  auVar121 = vfmadd231ps_fma(auVar212,auVar138,auVar16);
  auVar139 = vfmadd231ps_fma(auVar208,auVar138,auVar18);
  auVar138 = vfmadd231ps_fma(auVar197,auVar122,auVar138);
  auVar166 = vfmadd231ps_fma(auVar121,auVar228,auVar20);
  auVar139 = vfmadd231ps_fma(auVar139,auVar228,auVar17);
  auVar177 = vfmadd231ps_fma(auVar138,auVar123,auVar228);
  auVar229._4_4_ = auVar120._0_4_;
  auVar229._0_4_ = auVar120._0_4_;
  auVar229._8_4_ = auVar120._0_4_;
  auVar229._12_4_ = auVar120._0_4_;
  auVar138 = vshufps_avx(auVar120,auVar120,0x55);
  auVar121 = vshufps_avx(auVar120,auVar120,0xaa);
  fVar211 = auVar121._0_4_;
  auVar185._0_4_ = fVar211 * auVar125._0_4_;
  fVar216 = auVar121._4_4_;
  auVar185._4_4_ = fVar216 * auVar125._4_4_;
  fVar217 = auVar121._8_4_;
  auVar185._8_4_ = fVar217 * auVar125._8_4_;
  fVar218 = auVar121._12_4_;
  auVar185._12_4_ = fVar218 * auVar125._12_4_;
  auVar137._0_4_ = auVar19._0_4_ * fVar211;
  auVar137._4_4_ = auVar19._4_4_ * fVar216;
  auVar137._8_4_ = auVar19._8_4_ * fVar217;
  auVar137._12_4_ = auVar19._12_4_ * fVar218;
  auVar121._0_4_ = auVar155._0_4_ * fVar211;
  auVar121._4_4_ = auVar155._4_4_ * fVar216;
  auVar121._8_4_ = auVar155._8_4_ * fVar217;
  auVar121._12_4_ = auVar155._12_4_ * fVar218;
  auVar16 = vfmadd231ps_fma(auVar185,auVar138,auVar16);
  auVar125 = vfmadd231ps_fma(auVar137,auVar138,auVar18);
  auVar18 = vfmadd231ps_fma(auVar121,auVar138,auVar122);
  auVar19 = vfmadd231ps_fma(auVar16,auVar229,auVar20);
  auVar122 = vfmadd231ps_fma(auVar125,auVar229,auVar17);
  auVar155 = vfmadd231ps_fma(auVar18,auVar229,auVar123);
  local_2b0._8_4_ = 0x7fffffff;
  local_2b0._0_8_ = 0x7fffffff7fffffff;
  local_2b0._12_4_ = 0x7fffffff;
  auVar20 = vandps_avx(auVar166,local_2b0);
  auVar176._8_4_ = 0x219392ef;
  auVar176._0_8_ = 0x219392ef219392ef;
  auVar176._12_4_ = 0x219392ef;
  auVar20 = vcmpps_avx(auVar20,auVar176,1);
  auVar16 = vblendvps_avx(auVar166,auVar176,auVar20);
  auVar20 = vandps_avx(auVar139,local_2b0);
  auVar20 = vcmpps_avx(auVar20,auVar176,1);
  auVar125 = vblendvps_avx(auVar139,auVar176,auVar20);
  auVar20 = vandps_avx(auVar177,local_2b0);
  auVar20 = vcmpps_avx(auVar20,auVar176,1);
  auVar20 = vblendvps_avx(auVar177,auVar176,auVar20);
  auVar17 = vrcpps_avx(auVar16);
  auVar195._8_4_ = 0x3f800000;
  auVar195._0_8_ = 0x3f8000003f800000;
  auVar195._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar17,auVar195);
  auVar17 = vfmadd132ps_fma(auVar16,auVar17,auVar17);
  auVar16 = vrcpps_avx(auVar125);
  auVar125 = vfnmadd213ps_fma(auVar125,auVar16,auVar195);
  auVar18 = vfmadd132ps_fma(auVar125,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar20);
  auVar20 = vfnmadd213ps_fma(auVar20,auVar16,auVar195);
  auVar123 = vfmadd132ps_fma(auVar20,auVar16,auVar16);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar116 * 7 + 6);
  auVar20 = vpmovsxwd_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar177._0_4_ = auVar17._0_4_ * auVar20._0_4_;
  auVar177._4_4_ = auVar17._4_4_ * auVar20._4_4_;
  auVar177._8_4_ = auVar17._8_4_ * auVar20._8_4_;
  auVar177._12_4_ = auVar17._12_4_ * auVar20._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar116 * 9 + 6);
  auVar20 = vpmovsxwd_avx(auVar16);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar19);
  auVar186._0_4_ = auVar17._0_4_ * auVar20._0_4_;
  auVar186._4_4_ = auVar17._4_4_ * auVar20._4_4_;
  auVar186._8_4_ = auVar17._8_4_ * auVar20._8_4_;
  auVar186._12_4_ = auVar17._12_4_ * auVar20._12_4_;
  auVar139._1_3_ = 0;
  auVar139[0] = PVar12;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar16 = vpmovsxwd_avx(auVar125);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar116 * -2 + 6);
  auVar20 = vpmovsxwd_avx(auVar17);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar122);
  auVar198._0_4_ = auVar20._0_4_ * auVar18._0_4_;
  auVar198._4_4_ = auVar20._4_4_ * auVar18._4_4_;
  auVar198._8_4_ = auVar20._8_4_ * auVar18._8_4_;
  auVar198._12_4_ = auVar20._12_4_ * auVar18._12_4_;
  auVar20 = vcvtdq2ps_avx(auVar16);
  auVar20 = vsubps_avx(auVar20,auVar122);
  auVar138._0_4_ = auVar18._0_4_ * auVar20._0_4_;
  auVar138._4_4_ = auVar18._4_4_ * auVar20._4_4_;
  auVar138._8_4_ = auVar18._8_4_ * auVar20._8_4_;
  auVar138._12_4_ = auVar18._12_4_ * auVar20._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar113 + uVar116 + 6);
  auVar20 = vpmovsxwd_avx(auVar18);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar155);
  auVar166._0_4_ = auVar123._0_4_ * auVar20._0_4_;
  auVar166._4_4_ = auVar123._4_4_ * auVar20._4_4_;
  auVar166._8_4_ = auVar123._8_4_ * auVar20._8_4_;
  auVar166._12_4_ = auVar123._12_4_ * auVar20._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar116 * 0x17 + 6);
  auVar20 = vpmovsxwd_avx(auVar19);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar155);
  auVar122._0_4_ = auVar123._0_4_ * auVar20._0_4_;
  auVar122._4_4_ = auVar123._4_4_ * auVar20._4_4_;
  auVar122._8_4_ = auVar123._8_4_ * auVar20._8_4_;
  auVar122._12_4_ = auVar123._12_4_ * auVar20._12_4_;
  auVar20 = vpminsd_avx(auVar177,auVar186);
  auVar16 = vpminsd_avx(auVar198,auVar138);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  auVar16 = vpminsd_avx(auVar166,auVar122);
  uVar118 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar203._4_4_ = uVar118;
  auVar203._0_4_ = uVar118;
  auVar203._8_4_ = uVar118;
  auVar203._12_4_ = uVar118;
  auVar16 = vmaxps_avx(auVar16,auVar203);
  auVar20 = vmaxps_avx(auVar20,auVar16);
  local_2c0._0_4_ = auVar20._0_4_ * 0.99999964;
  local_2c0._4_4_ = auVar20._4_4_ * 0.99999964;
  local_2c0._8_4_ = auVar20._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar20._12_4_ * 0.99999964;
  auVar20 = vpmaxsd_avx(auVar177,auVar186);
  auVar16 = vpmaxsd_avx(auVar198,auVar138);
  auVar20 = vminps_avx(auVar20,auVar16);
  auVar16 = vpmaxsd_avx(auVar166,auVar122);
  fVar211 = (ray->super_RayK<1>).tfar;
  auVar155._4_4_ = fVar211;
  auVar155._0_4_ = fVar211;
  auVar155._8_4_ = fVar211;
  auVar155._12_4_ = fVar211;
  auVar16 = vminps_avx(auVar16,auVar155);
  auVar20 = vminps_avx(auVar20,auVar16);
  auVar123._0_4_ = auVar20._0_4_ * 1.0000004;
  auVar123._4_4_ = auVar20._4_4_ * 1.0000004;
  auVar123._8_4_ = auVar20._8_4_ * 1.0000004;
  auVar123._12_4_ = auVar20._12_4_ * 1.0000004;
  auVar139[4] = PVar12;
  auVar139._5_3_ = 0;
  auVar139[8] = PVar12;
  auVar139._9_3_ = 0;
  auVar139[0xc] = PVar12;
  auVar139._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar139,_DAT_01f7fcf0);
  auVar20 = vcmpps_avx(local_2c0,auVar123,2);
  auVar20 = vandps_avx(auVar20,auVar16);
  uVar110 = vmovmskps_avx(auVar20);
  if (uVar110 != 0) {
    uVar110 = uVar110 & 0xff;
    local_500[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_500[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_500[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_500[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_6c0 = prim;
    local_6b8 = pre;
    do {
      auVar149 = local_480;
      lVar27 = 0;
      uVar116 = (ulong)uVar110;
      for (uVar113 = uVar116; (uVar113 & 1) == 0; uVar113 = uVar113 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar110 = *(uint *)(prim + 2);
      uVar112 = *(uint *)(prim + lVar27 * 4 + 6);
      local_788 = (ulong)uVar110;
      pGVar115 = (context->scene->geometries).items[uVar110].ptr;
      local_728 = (ulong)uVar112;
      uVar113 = (ulong)*(uint *)(*(long *)&pGVar115->field_0x58 +
                                pGVar115[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar112);
      p_Var14 = pGVar115[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar115[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar27 + (long)p_Var14 * uVar113);
      local_6d0 = *(undefined8 *)*pauVar1;
      uStack_6c8 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar27 + (uVar113 + 1) * (long)p_Var14);
      local_6e0 = *(undefined8 *)*pauVar2;
      uStack_6d8 = *(undefined8 *)(*pauVar2 + 8);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar113 + 2) * (long)p_Var14);
      local_6f0 = *(undefined8 *)*pauVar3;
      uStack_6e8 = *(undefined8 *)(*pauVar3 + 8);
      uVar116 = uVar116 - 1 & uVar116;
      pauVar4 = (undefined1 (*) [12])(lVar27 + (uVar113 + 3) * (long)p_Var14);
      local_200 = *(undefined8 *)*pauVar4;
      uStack_1f8 = *(undefined8 *)(*pauVar4 + 8);
      local_700 = (float)local_200;
      fStack_6fc = (float)((ulong)local_200 >> 0x20);
      fStack_6f8 = (float)uStack_1f8;
      fStack_6f4 = (float)((ulong)uStack_1f8 >> 0x20);
      if (uVar116 != 0) {
        uVar114 = uVar116 - 1 & uVar116;
        for (uVar113 = uVar116; (uVar113 & 1) == 0; uVar113 = uVar113 >> 1 | 0x8000000000000000) {
        }
        if (uVar114 != 0) {
          for (; (uVar114 & 1) == 0; uVar114 = uVar114 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar115[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar7 = (ray->super_RayK<1>).org.field_0;
      auVar16 = vsubps_avx(*pauVar1,(undefined1  [16])aVar7);
      uVar118 = auVar16._0_4_;
      auVar167._4_4_ = uVar118;
      auVar167._0_4_ = uVar118;
      auVar167._8_4_ = uVar118;
      auVar167._12_4_ = uVar118;
      auVar20 = vshufps_avx(auVar16,auVar16,0x55);
      auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
      aVar8 = (pre->ray_space).vx.field_0;
      aVar9 = (pre->ray_space).vy.field_0;
      fVar211 = (pre->ray_space).vz.field_0.m128[0];
      fVar216 = (pre->ray_space).vz.field_0.m128[1];
      fVar217 = (pre->ray_space).vz.field_0.m128[2];
      fVar218 = (pre->ray_space).vz.field_0.m128[3];
      auVar187._0_4_ = auVar16._0_4_ * fVar211;
      auVar187._4_4_ = auVar16._4_4_ * fVar216;
      auVar187._8_4_ = auVar16._8_4_ * fVar217;
      auVar187._12_4_ = auVar16._12_4_ * fVar218;
      auVar20 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar9,auVar20);
      auVar19 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar8,auVar167);
      auVar20 = vblendps_avx(auVar19,*pauVar1,8);
      auVar125 = vsubps_avx(*pauVar2,(undefined1  [16])aVar7);
      uVar118 = auVar125._0_4_;
      auVar188._4_4_ = uVar118;
      auVar188._0_4_ = uVar118;
      auVar188._8_4_ = uVar118;
      auVar188._12_4_ = uVar118;
      auVar16 = vshufps_avx(auVar125,auVar125,0x55);
      auVar125 = vshufps_avx(auVar125,auVar125,0xaa);
      auVar204._0_4_ = auVar125._0_4_ * fVar211;
      auVar204._4_4_ = auVar125._4_4_ * fVar216;
      auVar204._8_4_ = auVar125._8_4_ * fVar217;
      auVar204._12_4_ = auVar125._12_4_ * fVar218;
      auVar16 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar9,auVar16);
      auVar123 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar8,auVar188);
      auVar16 = vblendps_avx(auVar123,*pauVar2,8);
      auVar17 = vsubps_avx(*pauVar3,(undefined1  [16])aVar7);
      uVar118 = auVar17._0_4_;
      auVar192._4_4_ = uVar118;
      auVar192._0_4_ = uVar118;
      auVar192._8_4_ = uVar118;
      auVar192._12_4_ = uVar118;
      auVar125 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar213._0_4_ = auVar17._0_4_ * fVar211;
      auVar213._4_4_ = auVar17._4_4_ * fVar216;
      auVar213._8_4_ = auVar17._8_4_ * fVar217;
      auVar213._12_4_ = auVar17._12_4_ * fVar218;
      auVar125 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar9,auVar125);
      auVar122 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar8,auVar192);
      auVar125 = vblendps_avx(auVar122,*pauVar3,8);
      auVar96._12_4_ = fStack_6f4;
      auVar96._0_12_ = *pauVar4;
      local_4c0._0_16_ = (undefined1  [16])aVar7;
      auVar18 = vsubps_avx(auVar96,(undefined1  [16])aVar7);
      uVar118 = auVar18._0_4_;
      auVar196._4_4_ = uVar118;
      auVar196._0_4_ = uVar118;
      auVar196._8_4_ = uVar118;
      auVar196._12_4_ = uVar118;
      auVar17 = vshufps_avx(auVar18,auVar18,0x55);
      auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
      auVar223._0_4_ = auVar18._0_4_ * fVar211;
      auVar223._4_4_ = auVar18._4_4_ * fVar216;
      auVar223._8_4_ = auVar18._8_4_ * fVar217;
      auVar223._12_4_ = auVar18._12_4_ * fVar218;
      auVar17 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar9,auVar17);
      auVar155 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar8,auVar196);
      auVar17 = vblendps_avx(auVar155,auVar96,8);
      auVar20 = vandps_avx(auVar20,local_2b0);
      auVar16 = vandps_avx(auVar16,local_2b0);
      auVar18 = vmaxps_avx(auVar20,auVar16);
      auVar20 = vandps_avx(auVar125,local_2b0);
      auVar16 = vandps_avx(auVar17,local_2b0);
      auVar20 = vmaxps_avx(auVar20,auVar16);
      auVar20 = vmaxps_avx(auVar18,auVar20);
      auVar16 = vmovshdup_avx(auVar20);
      auVar16 = vmaxss_avx(auVar16,auVar20);
      auVar20 = vshufpd_avx(auVar20,auVar20,1);
      auVar20 = vmaxss_avx(auVar20,auVar16);
      lVar27 = (long)iVar13 * 0x44;
      auVar16 = vmovshdup_avx(auVar19);
      local_4a0 = auVar16._0_8_;
      uStack_498 = local_4a0;
      uStack_490 = local_4a0;
      uStack_488 = local_4a0;
      auVar16 = vmovshdup_avx(auVar123);
      uVar119 = auVar16._0_8_;
      local_440._8_8_ = uVar119;
      local_440._0_8_ = uVar119;
      local_440._16_8_ = uVar119;
      local_440._24_8_ = uVar119;
      auVar10 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x908);
      uVar210 = auVar122._0_4_;
      local_580._4_4_ = uVar210;
      local_580._0_4_ = uVar210;
      local_580._8_4_ = uVar210;
      local_580._12_4_ = uVar210;
      local_580._16_4_ = uVar210;
      local_580._20_4_ = uVar210;
      local_580._24_4_ = uVar210;
      local_580._28_4_ = uVar210;
      auVar16 = vmovshdup_avx(auVar122);
      uVar119 = auVar16._0_8_;
      local_520._8_8_ = uVar119;
      local_520._0_8_ = uVar119;
      local_520._16_8_ = uVar119;
      local_520._24_8_ = uVar119;
      fVar227 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar27 + 0xd8c);
      fVar83 = *(float *)(catmullrom_basis0 + lVar27 + 0xd90);
      fVar84 = *(float *)(catmullrom_basis0 + lVar27 + 0xd94);
      fVar85 = *(float *)(catmullrom_basis0 + lVar27 + 0xd98);
      fVar86 = *(float *)(catmullrom_basis0 + lVar27 + 0xd9c);
      fVar87 = *(float *)(catmullrom_basis0 + lVar27 + 0xda0);
      fVar88 = *(float *)(catmullrom_basis0 + lVar27 + 0xda4);
      auVar109 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar27 + 0xd8c);
      local_420 = auVar155._0_4_;
      auVar16 = vmovshdup_avx(auVar155);
      local_140 = auVar16._0_8_;
      auVar133._0_4_ = fVar227 * local_420;
      auVar133._4_4_ = fVar83 * local_420;
      auVar133._8_4_ = fVar84 * local_420;
      auVar133._12_4_ = fVar85 * local_420;
      auVar133._16_4_ = fVar86 * local_420;
      auVar133._20_4_ = fVar87 * local_420;
      auVar133._24_4_ = fVar88 * local_420;
      auVar133._28_4_ = 0;
      fVar232 = auVar16._0_4_;
      auVar126._0_4_ = fVar232 * fVar227;
      fVar234 = auVar16._4_4_;
      auVar126._4_4_ = fVar234 * fVar83;
      auVar126._8_4_ = fVar232 * fVar84;
      auVar126._12_4_ = fVar234 * fVar85;
      auVar126._16_4_ = fVar232 * fVar86;
      auVar126._20_4_ = fVar234 * fVar87;
      auVar126._24_4_ = fVar232 * fVar88;
      auVar126._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar133,auVar10,local_580);
      auVar125 = vfmadd231ps_fma(auVar126,auVar10,local_520);
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x484);
      uVar118 = auVar123._0_4_;
      local_660._4_4_ = uVar118;
      local_660._0_4_ = uVar118;
      local_660._8_4_ = uVar118;
      local_660._12_4_ = uVar118;
      local_660._16_4_ = uVar118;
      local_660._20_4_ = uVar118;
      local_660._24_4_ = uVar118;
      local_660._28_4_ = uVar118;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar126,local_660);
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar126,local_440);
      auVar133 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27);
      uVar118 = auVar19._0_4_;
      local_680._4_4_ = uVar118;
      local_680._0_4_ = uVar118;
      local_680._8_4_ = uVar118;
      local_680._12_4_ = uVar118;
      local_680._16_4_ = uVar118;
      local_680._20_4_ = uVar118;
      local_680._24_4_ = uVar118;
      local_680._28_4_ = uVar118;
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar133,local_680);
      auVar21._8_8_ = local_4a0;
      auVar21._0_8_ = local_4a0;
      auVar21._16_8_ = local_4a0;
      auVar21._24_8_ = local_4a0;
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar133,auVar21);
      auVar146 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x908);
      fVar89 = *(float *)(catmullrom_basis1 + lVar27 + 0xd8c);
      fVar90 = *(float *)(catmullrom_basis1 + lVar27 + 0xd90);
      fVar91 = *(float *)(catmullrom_basis1 + lVar27 + 0xd94);
      fVar92 = *(float *)(catmullrom_basis1 + lVar27 + 0xd98);
      fVar93 = *(float *)(catmullrom_basis1 + lVar27 + 0xd9c);
      fVar94 = *(float *)(catmullrom_basis1 + lVar27 + 0xda0);
      fVar95 = *(float *)(catmullrom_basis1 + lVar27 + 0xda4);
      fStack_41c = local_420;
      fStack_418 = local_420;
      fStack_414 = local_420;
      fStack_410 = local_420;
      fStack_40c = local_420;
      fStack_408 = local_420;
      fStack_404 = local_420;
      auVar200._4_4_ = fVar90 * local_420;
      auVar200._0_4_ = fVar89 * local_420;
      auVar200._8_4_ = fVar91 * local_420;
      auVar200._12_4_ = fVar92 * local_420;
      auVar200._16_4_ = fVar93 * local_420;
      auVar200._20_4_ = fVar94 * local_420;
      auVar200._24_4_ = fVar95 * local_420;
      auVar200._28_4_ = local_420;
      auVar17 = vfmadd231ps_fma(auVar200,auVar146,local_580);
      uStack_138 = local_140;
      uStack_130 = local_140;
      uStack_128 = local_140;
      auVar164._4_4_ = fVar234 * fVar90;
      auVar164._0_4_ = fVar232 * fVar89;
      auVar164._8_4_ = fVar232 * fVar91;
      auVar164._12_4_ = fVar234 * fVar92;
      auVar164._16_4_ = fVar232 * fVar93;
      auVar164._20_4_ = fVar234 * fVar94;
      auVar164._24_4_ = fVar232 * fVar95;
      auVar164._28_4_ = uVar210;
      auVar18 = vfmadd231ps_fma(auVar164,auVar146,local_520);
      auVar200 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x484);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar200,local_660);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar200,local_440);
      auVar164 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar164,local_680);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar164,auVar21);
      local_300 = ZEXT1632(auVar17);
      local_340 = ZEXT1632(auVar16);
      local_380 = vsubps_avx(local_300,local_340);
      local_320 = ZEXT1632(auVar18);
      local_2e0 = ZEXT1632(auVar125);
      local_460 = vsubps_avx(local_320,local_2e0);
      auVar127._0_4_ = local_380._0_4_ * auVar125._0_4_;
      auVar127._4_4_ = local_380._4_4_ * auVar125._4_4_;
      auVar127._8_4_ = local_380._8_4_ * auVar125._8_4_;
      auVar127._12_4_ = local_380._12_4_ * auVar125._12_4_;
      auVar127._16_4_ = local_380._16_4_ * 0.0;
      auVar127._20_4_ = local_380._20_4_ * 0.0;
      auVar127._24_4_ = local_380._24_4_ * 0.0;
      auVar127._28_4_ = 0;
      fVar211 = local_460._0_4_;
      auVar142._0_4_ = auVar16._0_4_ * fVar211;
      fVar217 = local_460._4_4_;
      auVar142._4_4_ = auVar16._4_4_ * fVar217;
      fVar219 = local_460._8_4_;
      auVar142._8_4_ = auVar16._8_4_ * fVar219;
      fVar220 = local_460._12_4_;
      auVar142._12_4_ = auVar16._12_4_ * fVar220;
      fVar221 = local_460._16_4_;
      auVar142._16_4_ = fVar221 * 0.0;
      fVar136 = local_460._20_4_;
      auVar142._20_4_ = fVar136 * 0.0;
      fVar222 = local_460._24_4_;
      auVar142._24_4_ = fVar222 * 0.0;
      auVar142._28_4_ = 0;
      auVar21 = vsubps_avx(auVar127,auVar142);
      auVar16 = vpermilps_avx(*pauVar1,0xff);
      uVar119 = auVar16._0_8_;
      local_80._8_8_ = uVar119;
      local_80._0_8_ = uVar119;
      local_80._16_8_ = uVar119;
      local_80._24_8_ = uVar119;
      auVar125 = vpermilps_avx(*pauVar2,0xff);
      uVar119 = auVar125._0_8_;
      local_a0._8_8_ = uVar119;
      local_a0._0_8_ = uVar119;
      local_a0._16_8_ = uVar119;
      local_a0._24_8_ = uVar119;
      auVar125 = vpermilps_avx(*pauVar3,0xff);
      uVar119 = auVar125._0_8_;
      local_c0._8_8_ = uVar119;
      local_c0._0_8_ = uVar119;
      local_c0._16_8_ = uVar119;
      local_c0._24_8_ = uVar119;
      auVar97._12_4_ = fStack_6f4;
      auVar97._0_12_ = *pauVar4;
      auVar125 = vpermilps_avx(auVar97,0xff);
      local_e0 = auVar125._0_8_;
      fVar216 = auVar125._0_4_;
      fVar218 = auVar125._4_4_;
      auVar15._4_4_ = fVar83 * fVar218;
      auVar15._0_4_ = fVar227 * fVar216;
      auVar15._8_4_ = fVar84 * fVar216;
      auVar15._12_4_ = fVar85 * fVar218;
      auVar15._16_4_ = fVar86 * fVar216;
      auVar15._20_4_ = fVar87 * fVar218;
      auVar15._24_4_ = fVar88 * fVar216;
      auVar15._28_4_ = *(undefined4 *)(catmullrom_basis0 + lVar27 + 0xda8);
      auVar125 = vfmadd231ps_fma(auVar15,local_c0,auVar10);
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar126,local_a0);
      auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar133,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar23._4_4_ = fVar90 * fVar218;
      auVar23._0_4_ = fVar89 * fVar216;
      auVar23._8_4_ = fVar91 * fVar216;
      auVar23._12_4_ = fVar92 * fVar218;
      auVar23._16_4_ = fVar93 * fVar216;
      auVar23._20_4_ = fVar94 * fVar218;
      auVar23._24_4_ = fVar95 * fVar216;
      auVar23._28_4_ = fVar218;
      auVar17 = vfmadd231ps_fma(auVar23,auVar146,local_c0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar200,local_a0);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar164,local_80);
      auVar24._4_4_ = fVar217 * fVar217;
      auVar24._0_4_ = fVar211 * fVar211;
      auVar24._8_4_ = fVar219 * fVar219;
      auVar24._12_4_ = fVar220 * fVar220;
      auVar24._16_4_ = fVar221 * fVar221;
      auVar24._20_4_ = fVar136 * fVar136;
      auVar24._24_4_ = fVar222 * fVar222;
      auVar24._28_4_ = auVar16._4_4_;
      auVar16 = vfmadd231ps_fma(auVar24,local_380,local_380);
      local_760 = ZEXT1632(auVar17);
      auVar15 = vmaxps_avx(ZEXT1632(auVar125),local_760);
      auVar25._4_4_ = auVar15._4_4_ * auVar15._4_4_ * auVar16._4_4_;
      auVar25._0_4_ = auVar15._0_4_ * auVar15._0_4_ * auVar16._0_4_;
      auVar25._8_4_ = auVar15._8_4_ * auVar15._8_4_ * auVar16._8_4_;
      auVar25._12_4_ = auVar15._12_4_ * auVar15._12_4_ * auVar16._12_4_;
      auVar25._16_4_ = auVar15._16_4_ * auVar15._16_4_ * 0.0;
      auVar25._20_4_ = auVar15._20_4_ * auVar15._20_4_ * 0.0;
      auVar25._24_4_ = auVar15._24_4_ * auVar15._24_4_ * 0.0;
      auVar25._28_4_ = auVar15._28_4_;
      auVar22._4_4_ = auVar21._4_4_ * auVar21._4_4_;
      auVar22._0_4_ = auVar21._0_4_ * auVar21._0_4_;
      auVar22._8_4_ = auVar21._8_4_ * auVar21._8_4_;
      auVar22._12_4_ = auVar21._12_4_ * auVar21._12_4_;
      auVar22._16_4_ = auVar21._16_4_ * auVar21._16_4_;
      auVar22._20_4_ = auVar21._20_4_ * auVar21._20_4_;
      auVar22._24_4_ = auVar21._24_4_ * auVar21._24_4_;
      auVar22._28_4_ = auVar21._28_4_;
      auVar15 = vcmpps_avx(auVar22,auVar25,2);
      auVar128._0_4_ = (float)iVar13;
      local_480._4_12_ = auVar155._4_12_;
      local_480._0_4_ = auVar128._0_4_;
      fVar211 = auVar20._0_4_ * 4.7683716e-07;
      local_720._0_16_ = ZEXT416((uint)fVar211);
      local_480._16_16_ = auVar149._16_16_;
      auVar128._4_4_ = auVar128._0_4_;
      auVar128._8_4_ = auVar128._0_4_;
      auVar128._12_4_ = auVar128._0_4_;
      auVar128._16_4_ = auVar128._0_4_;
      auVar128._20_4_ = auVar128._0_4_;
      auVar128._24_4_ = auVar128._0_4_;
      auVar128._28_4_ = auVar128._0_4_;
      auVar149 = vcmpps_avx(_DAT_01faff40,auVar128,1);
      auVar20 = vpermilps_avx(auVar19,0xaa);
      uVar119 = auVar20._0_8_;
      auVar172._8_8_ = uVar119;
      auVar172._0_8_ = uVar119;
      auVar172._16_8_ = uVar119;
      auVar172._24_8_ = uVar119;
      auVar20 = vpermilps_avx(auVar123,0xaa);
      uVar119 = auVar20._0_8_;
      local_620._8_8_ = uVar119;
      local_620._0_8_ = uVar119;
      local_620._16_8_ = uVar119;
      local_620._24_8_ = uVar119;
      auVar16 = vpermilps_avx(auVar122,0xaa);
      uVar119 = auVar16._0_8_;
      auVar209._8_8_ = uVar119;
      auVar209._0_8_ = uVar119;
      auVar209._16_8_ = uVar119;
      auVar209._24_8_ = uVar119;
      auVar20 = vshufps_avx(auVar155,auVar155,0xaa);
      uVar119 = auVar20._0_8_;
      register0x00001508 = uVar119;
      local_5a0 = uVar119;
      register0x00001510 = uVar119;
      register0x00001518 = uVar119;
      auVar225 = ZEXT3264(_local_5a0);
      auVar21 = auVar149 & auVar15;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        auVar215 = ZEXT3264(local_620);
        auVar202 = ZEXT3264(local_660);
        auVar233 = ZEXT3264(local_680);
LAB_01613841:
        auVar175 = ZEXT3264(local_520);
        auVar154 = ZEXT3264(local_580);
        fVar211 = (float)local_720._0_4_;
      }
      else {
        _local_360 = vandps_avx(auVar15,auVar149);
        fVar222 = auVar20._0_4_;
        fVar227 = auVar20._4_4_;
        auVar149._4_4_ = fVar227 * fVar90;
        auVar149._0_4_ = fVar222 * fVar89;
        auVar149._8_4_ = fVar222 * fVar91;
        auVar149._12_4_ = fVar227 * fVar92;
        auVar149._16_4_ = fVar222 * fVar93;
        auVar149._20_4_ = fVar227 * fVar94;
        auVar149._24_4_ = fVar222 * fVar95;
        auVar149._28_4_ = local_360._28_4_;
        auVar20 = vfmadd213ps_fma(auVar146,auVar209,auVar149);
        auVar20 = vfmadd213ps_fma(auVar200,local_620,ZEXT1632(auVar20));
        auVar20 = vfmadd213ps_fma(auVar164,auVar172,ZEXT1632(auVar20));
        local_560._0_4_ = auVar109._0_4_;
        local_560._4_4_ = auVar109._4_4_;
        fStack_558 = auVar109._8_4_;
        fStack_554 = auVar109._12_4_;
        fStack_550 = auVar109._16_4_;
        fStack_54c = auVar109._20_4_;
        fStack_548 = auVar109._24_4_;
        auVar129._0_4_ = fVar222 * (float)local_560._0_4_;
        auVar129._4_4_ = fVar227 * (float)local_560._4_4_;
        auVar129._8_4_ = fVar222 * fStack_558;
        auVar129._12_4_ = fVar227 * fStack_554;
        auVar129._16_4_ = fVar222 * fStack_550;
        auVar129._20_4_ = fVar227 * fStack_54c;
        auVar129._24_4_ = fVar222 * fStack_548;
        auVar129._28_4_ = 0;
        auVar17 = vfmadd213ps_fma(auVar10,auVar209,auVar129);
        auVar17 = vfmadd213ps_fma(auVar126,local_620,ZEXT1632(auVar17));
        auVar149 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1210);
        auVar10 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1694);
        auVar146 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1b18);
        local_640 = auVar172;
        fVar216 = *(float *)(catmullrom_basis0 + lVar27 + 0x1f9c);
        fVar217 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fa0);
        fVar218 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fa4);
        fVar219 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fa8);
        fVar220 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fac);
        fVar221 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fb0);
        fVar136 = *(float *)(catmullrom_basis0 + lVar27 + 0x1fb4);
        auVar28._4_4_ = fVar217 * local_420;
        auVar28._0_4_ = fVar216 * local_420;
        auVar28._8_4_ = fVar218 * local_420;
        auVar28._12_4_ = fVar219 * local_420;
        auVar28._16_4_ = fVar220 * local_420;
        auVar28._20_4_ = fVar221 * local_420;
        auVar28._24_4_ = fVar136 * local_420;
        auVar28._28_4_ = local_460._28_4_;
        auVar199._0_4_ = fVar232 * fVar216;
        auVar199._4_4_ = fVar234 * fVar217;
        auVar199._8_4_ = fVar232 * fVar218;
        auVar199._12_4_ = fVar234 * fVar219;
        auVar199._16_4_ = fVar232 * fVar220;
        auVar199._20_4_ = fVar234 * fVar221;
        auVar199._24_4_ = fVar232 * fVar136;
        auVar199._28_4_ = 0;
        auVar29._4_4_ = fVar217 * fVar227;
        auVar29._0_4_ = fVar216 * fVar222;
        auVar29._8_4_ = fVar218 * fVar222;
        auVar29._12_4_ = fVar219 * fVar227;
        auVar29._16_4_ = fVar220 * fVar222;
        auVar29._20_4_ = fVar221 * fVar227;
        auVar29._24_4_ = fVar136 * fVar222;
        auVar29._28_4_ = auVar16._4_4_;
        auVar16 = vfmadd231ps_fma(auVar28,auVar146,local_580);
        auVar18 = vfmadd231ps_fma(auVar199,auVar146,local_520);
        auVar19 = vfmadd231ps_fma(auVar29,auVar209,auVar146);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar10,local_660);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar10,local_440);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar10,local_620);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar149,local_680);
        auVar107._8_8_ = local_4a0;
        auVar107._0_8_ = local_4a0;
        auVar107._16_8_ = local_4a0;
        auVar107._24_8_ = local_4a0;
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar149,auVar107);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar149,auVar172);
        fVar216 = *(float *)(catmullrom_basis1 + lVar27 + 0x1f9c);
        fVar217 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fa0);
        fVar218 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fa4);
        fVar219 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fa8);
        fVar220 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fac);
        fVar221 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fb0);
        fVar136 = *(float *)(catmullrom_basis1 + lVar27 + 0x1fb4);
        auVar10._4_4_ = local_420 * fVar217;
        auVar10._0_4_ = local_420 * fVar216;
        auVar10._8_4_ = local_420 * fVar218;
        auVar10._12_4_ = local_420 * fVar219;
        auVar10._16_4_ = local_420 * fVar220;
        auVar10._20_4_ = local_420 * fVar221;
        auVar10._24_4_ = local_420 * fVar136;
        auVar10._28_4_ = auVar126._28_4_;
        auVar146._4_4_ = fVar234 * fVar217;
        auVar146._0_4_ = fVar232 * fVar216;
        auVar146._8_4_ = fVar232 * fVar218;
        auVar146._12_4_ = fVar234 * fVar219;
        auVar146._16_4_ = fVar232 * fVar220;
        auVar146._20_4_ = fVar234 * fVar221;
        auVar146._24_4_ = fVar232 * fVar136;
        auVar146._28_4_ = fVar234;
        auVar30._4_4_ = fVar227 * fVar217;
        auVar30._0_4_ = fVar222 * fVar216;
        auVar30._8_4_ = fVar222 * fVar218;
        auVar30._12_4_ = fVar227 * fVar219;
        auVar30._16_4_ = fVar222 * fVar220;
        auVar30._20_4_ = fVar227 * fVar221;
        auVar30._24_4_ = fVar222 * fVar136;
        auVar30._28_4_ = fVar227;
        auVar149 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1b18);
        auVar123 = vfmadd231ps_fma(auVar10,auVar149,local_580);
        auVar122 = vfmadd231ps_fma(auVar146,auVar149,local_520);
        _local_560 = auVar209;
        auVar155 = vfmadd231ps_fma(auVar30,auVar209,auVar149);
        auVar149 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1694);
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar149,local_660);
        auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar149,local_440);
        auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar149,local_620);
        auVar149 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1210);
        auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar149,local_680);
        auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar149,auVar107);
        auVar143._8_4_ = 0x7fffffff;
        auVar143._0_8_ = 0x7fffffff7fffffff;
        auVar143._12_4_ = 0x7fffffff;
        auVar143._16_4_ = 0x7fffffff;
        auVar143._20_4_ = 0x7fffffff;
        auVar143._24_4_ = 0x7fffffff;
        auVar143._28_4_ = 0x7fffffff;
        auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar172,auVar149);
        auVar149 = vandps_avx(ZEXT1632(auVar16),auVar143);
        auVar10 = vandps_avx(ZEXT1632(auVar18),auVar143);
        auVar10 = vmaxps_avx(auVar149,auVar10);
        auVar149 = vandps_avx(ZEXT1632(auVar19),auVar143);
        auVar149 = vmaxps_avx(auVar10,auVar149);
        auVar162._4_4_ = fVar211;
        auVar162._0_4_ = fVar211;
        auVar162._8_4_ = fVar211;
        auVar162._12_4_ = fVar211;
        auVar162._16_4_ = fVar211;
        auVar162._20_4_ = fVar211;
        auVar162._24_4_ = fVar211;
        auVar162._28_4_ = fVar211;
        auVar149 = vcmpps_avx(auVar149,auVar162,1);
        auVar126 = vblendvps_avx(ZEXT1632(auVar16),local_380,auVar149);
        auVar146 = vblendvps_avx(ZEXT1632(auVar18),local_460,auVar149);
        auVar149 = vandps_avx(ZEXT1632(auVar123),auVar143);
        auVar10 = vandps_avx(ZEXT1632(auVar122),auVar143);
        auVar200 = vmaxps_avx(auVar149,auVar10);
        auVar149 = vandps_avx(ZEXT1632(auVar155),auVar143);
        auVar149 = vmaxps_avx(auVar200,auVar149);
        auVar164 = vcmpps_avx(auVar149,auVar162,1);
        auVar149 = vblendvps_avx(ZEXT1632(auVar123),local_380,auVar164);
        auVar200 = vblendvps_avx(ZEXT1632(auVar122),local_460,auVar164);
        auVar16 = vfmadd213ps_fma(auVar133,auVar172,ZEXT1632(auVar17));
        auVar17 = vfmadd213ps_fma(auVar126,auVar126,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar146,auVar146);
        auVar133 = vrsqrtps_avx(ZEXT1632(auVar17));
        fVar216 = auVar133._0_4_;
        fVar217 = auVar133._4_4_;
        fVar218 = auVar133._8_4_;
        fVar219 = auVar133._12_4_;
        fVar220 = auVar133._16_4_;
        fVar221 = auVar133._20_4_;
        fVar136 = auVar133._24_4_;
        auVar31._4_4_ = fVar217 * fVar217 * fVar217 * auVar17._4_4_ * -0.5;
        auVar31._0_4_ = fVar216 * fVar216 * fVar216 * auVar17._0_4_ * -0.5;
        auVar31._8_4_ = fVar218 * fVar218 * fVar218 * auVar17._8_4_ * -0.5;
        auVar31._12_4_ = fVar219 * fVar219 * fVar219 * auVar17._12_4_ * -0.5;
        auVar31._16_4_ = fVar220 * fVar220 * fVar220 * -0.0;
        auVar31._20_4_ = fVar221 * fVar221 * fVar221 * -0.0;
        auVar31._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
        auVar31._28_4_ = 0;
        auVar230._8_4_ = 0x3fc00000;
        auVar230._0_8_ = 0x3fc000003fc00000;
        auVar230._12_4_ = 0x3fc00000;
        auVar230._16_4_ = 0x3fc00000;
        auVar230._20_4_ = 0x3fc00000;
        auVar230._24_4_ = 0x3fc00000;
        auVar230._28_4_ = 0x3fc00000;
        auVar17 = vfmadd231ps_fma(auVar31,auVar230,auVar133);
        fVar216 = auVar17._0_4_;
        fVar217 = auVar17._4_4_;
        auVar32._4_4_ = auVar146._4_4_ * fVar217;
        auVar32._0_4_ = auVar146._0_4_ * fVar216;
        fVar218 = auVar17._8_4_;
        auVar32._8_4_ = auVar146._8_4_ * fVar218;
        fVar219 = auVar17._12_4_;
        auVar32._12_4_ = auVar146._12_4_ * fVar219;
        auVar32._16_4_ = auVar146._16_4_ * 0.0;
        auVar32._20_4_ = auVar146._20_4_ * 0.0;
        auVar32._24_4_ = auVar146._24_4_ * 0.0;
        auVar32._28_4_ = auVar133._28_4_;
        auVar33._4_4_ = fVar217 * -auVar126._4_4_;
        auVar33._0_4_ = fVar216 * -auVar126._0_4_;
        auVar33._8_4_ = fVar218 * -auVar126._8_4_;
        auVar33._12_4_ = fVar219 * -auVar126._12_4_;
        auVar33._16_4_ = -auVar126._16_4_ * 0.0;
        auVar33._20_4_ = -auVar126._20_4_ * 0.0;
        auVar33._24_4_ = -auVar126._24_4_ * 0.0;
        auVar33._28_4_ = auVar10._28_4_;
        auVar17 = vfmadd213ps_fma(auVar149,auVar149,ZEXT832(0) << 0x20);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar200,auVar200);
        auVar10 = vrsqrtps_avx(ZEXT1632(auVar17));
        auVar34._28_4_ = auVar164._28_4_;
        auVar34._0_28_ =
             ZEXT1628(CONCAT412(fVar219 * 0.0,
                                CONCAT48(fVar218 * 0.0,CONCAT44(fVar217 * 0.0,fVar216 * 0.0))));
        fVar216 = auVar10._0_4_;
        fVar217 = auVar10._4_4_;
        fVar218 = auVar10._8_4_;
        fVar219 = auVar10._12_4_;
        fVar220 = auVar10._16_4_;
        fVar221 = auVar10._20_4_;
        fVar136 = auVar10._24_4_;
        auVar35._4_4_ = fVar217 * fVar217 * fVar217 * auVar17._4_4_ * -0.5;
        auVar35._0_4_ = fVar216 * fVar216 * fVar216 * auVar17._0_4_ * -0.5;
        auVar35._8_4_ = fVar218 * fVar218 * fVar218 * auVar17._8_4_ * -0.5;
        auVar35._12_4_ = fVar219 * fVar219 * fVar219 * auVar17._12_4_ * -0.5;
        auVar35._16_4_ = fVar220 * fVar220 * fVar220 * -0.0;
        auVar35._20_4_ = fVar221 * fVar221 * fVar221 * -0.0;
        auVar35._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
        auVar35._28_4_ = 0;
        auVar17 = vfmadd231ps_fma(auVar35,auVar230,auVar10);
        fVar216 = auVar17._0_4_;
        fVar217 = auVar17._4_4_;
        auVar36._4_4_ = auVar200._4_4_ * fVar217;
        auVar36._0_4_ = auVar200._0_4_ * fVar216;
        fVar218 = auVar17._8_4_;
        auVar36._8_4_ = auVar200._8_4_ * fVar218;
        fVar219 = auVar17._12_4_;
        auVar36._12_4_ = auVar200._12_4_ * fVar219;
        auVar36._16_4_ = auVar200._16_4_ * 0.0;
        auVar36._20_4_ = auVar200._20_4_ * 0.0;
        auVar36._24_4_ = auVar200._24_4_ * 0.0;
        auVar36._28_4_ = 0;
        auVar193._0_4_ = fVar216 * -auVar149._0_4_;
        auVar193._4_4_ = fVar217 * -auVar149._4_4_;
        auVar193._8_4_ = fVar218 * -auVar149._8_4_;
        auVar193._12_4_ = fVar219 * -auVar149._12_4_;
        auVar193._16_4_ = -auVar149._16_4_ * 0.0;
        auVar193._20_4_ = -auVar149._20_4_ * 0.0;
        auVar193._24_4_ = -auVar149._24_4_ * 0.0;
        auVar193._28_4_ = 0;
        auVar37._28_4_ = auVar10._28_4_;
        auVar37._0_28_ =
             ZEXT1628(CONCAT412(fVar219 * 0.0,
                                CONCAT48(fVar218 * 0.0,CONCAT44(fVar217 * 0.0,fVar216 * 0.0))));
        auVar17 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar125),local_340);
        auVar149 = ZEXT1632(auVar125);
        auVar18 = vfmadd213ps_fma(auVar33,auVar149,local_2e0);
        auVar19 = vfmadd213ps_fma(auVar34,auVar149,ZEXT1632(auVar16));
        auVar155 = vfnmadd213ps_fma(auVar32,auVar149,local_340);
        auVar123 = vfmadd213ps_fma(auVar36,local_760,local_300);
        auVar138 = vfnmadd213ps_fma(auVar33,auVar149,local_2e0);
        auVar122 = vfmadd213ps_fma(auVar193,local_760,local_320);
        local_600 = ZEXT1632(auVar125);
        auVar166 = vfnmadd231ps_fma(ZEXT1632(auVar16),local_600,auVar34);
        auVar16 = vfmadd213ps_fma(auVar37,local_760,ZEXT1632(auVar20));
        auVar121 = vfnmadd213ps_fma(auVar36,local_760,local_300);
        auVar139 = vfnmadd213ps_fma(auVar193,local_760,local_320);
        auVar177 = vfnmadd231ps_fma(ZEXT1632(auVar20),local_760,auVar37);
        auVar149 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar138));
        auVar10 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar166));
        auVar38._4_4_ = auVar166._4_4_ * auVar149._4_4_;
        auVar38._0_4_ = auVar166._0_4_ * auVar149._0_4_;
        auVar38._8_4_ = auVar166._8_4_ * auVar149._8_4_;
        auVar38._12_4_ = auVar166._12_4_ * auVar149._12_4_;
        auVar38._16_4_ = auVar149._16_4_ * 0.0;
        auVar38._20_4_ = auVar149._20_4_ * 0.0;
        auVar38._24_4_ = auVar149._24_4_ * 0.0;
        auVar38._28_4_ = 0;
        auVar125 = vfmsub231ps_fma(auVar38,ZEXT1632(auVar138),auVar10);
        auVar39._4_4_ = auVar155._4_4_ * auVar10._4_4_;
        auVar39._0_4_ = auVar155._0_4_ * auVar10._0_4_;
        auVar39._8_4_ = auVar155._8_4_ * auVar10._8_4_;
        auVar39._12_4_ = auVar155._12_4_ * auVar10._12_4_;
        auVar39._16_4_ = auVar10._16_4_ * 0.0;
        auVar39._20_4_ = auVar10._20_4_ * 0.0;
        auVar39._24_4_ = auVar10._24_4_ * 0.0;
        auVar39._28_4_ = auVar10._28_4_;
        auVar200 = ZEXT1632(auVar155);
        auVar10 = vsubps_avx(ZEXT1632(auVar123),auVar200);
        auVar20 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar166),auVar10);
        auVar40._4_4_ = auVar138._4_4_ * auVar10._4_4_;
        auVar40._0_4_ = auVar138._0_4_ * auVar10._0_4_;
        auVar40._8_4_ = auVar138._8_4_ * auVar10._8_4_;
        auVar40._12_4_ = auVar138._12_4_ * auVar10._12_4_;
        auVar40._16_4_ = auVar10._16_4_ * 0.0;
        auVar40._20_4_ = auVar10._20_4_ * 0.0;
        auVar40._24_4_ = auVar10._24_4_ * 0.0;
        auVar40._28_4_ = auVar10._28_4_;
        auVar155 = vfmsub231ps_fma(auVar40,auVar200,auVar149);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar155),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar125));
        auVar21 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
        local_540 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar17),auVar21);
        auVar149 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar18),auVar21);
        auVar10 = vblendvps_avx(ZEXT1632(auVar177),ZEXT1632(auVar19),auVar21);
        auVar126 = vblendvps_avx(auVar200,ZEXT1632(auVar123),auVar21);
        auVar133 = vblendvps_avx(ZEXT1632(auVar138),ZEXT1632(auVar122),auVar21);
        auVar146 = vblendvps_avx(ZEXT1632(auVar166),ZEXT1632(auVar16),auVar21);
        auVar200 = vblendvps_avx(ZEXT1632(auVar123),auVar200,auVar21);
        auVar164 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar138),auVar21);
        auVar20 = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
        local_780 = ZEXT1632(auVar20);
        auVar15 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar166),auVar21);
        auVar23 = vsubps_avx(auVar200,local_540);
        auVar164 = vsubps_avx(auVar164,auVar149);
        auVar24 = vsubps_avx(auVar15,auVar10);
        auVar25 = vsubps_avx(local_540,auVar126);
        auVar22 = vsubps_avx(auVar149,auVar133);
        auVar127 = vsubps_avx(auVar10,auVar146);
        auVar41._4_4_ = auVar24._4_4_ * local_540._4_4_;
        auVar41._0_4_ = auVar24._0_4_ * local_540._0_4_;
        auVar41._8_4_ = auVar24._8_4_ * local_540._8_4_;
        auVar41._12_4_ = auVar24._12_4_ * local_540._12_4_;
        auVar41._16_4_ = auVar24._16_4_ * local_540._16_4_;
        auVar41._20_4_ = auVar24._20_4_ * local_540._20_4_;
        auVar41._24_4_ = auVar24._24_4_ * local_540._24_4_;
        auVar41._28_4_ = auVar15._28_4_;
        auVar16 = vfmsub231ps_fma(auVar41,auVar10,auVar23);
        auVar42._4_4_ = auVar23._4_4_ * auVar149._4_4_;
        auVar42._0_4_ = auVar23._0_4_ * auVar149._0_4_;
        auVar42._8_4_ = auVar23._8_4_ * auVar149._8_4_;
        auVar42._12_4_ = auVar23._12_4_ * auVar149._12_4_;
        auVar42._16_4_ = auVar23._16_4_ * auVar149._16_4_;
        auVar42._20_4_ = auVar23._20_4_ * auVar149._20_4_;
        auVar42._24_4_ = auVar23._24_4_ * auVar149._24_4_;
        auVar42._28_4_ = auVar200._28_4_;
        auVar125 = vfmsub231ps_fma(auVar42,local_540,auVar164);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar130._0_4_ = auVar164._0_4_ * auVar10._0_4_;
        auVar130._4_4_ = auVar164._4_4_ * auVar10._4_4_;
        auVar130._8_4_ = auVar164._8_4_ * auVar10._8_4_;
        auVar130._12_4_ = auVar164._12_4_ * auVar10._12_4_;
        auVar130._16_4_ = auVar164._16_4_ * auVar10._16_4_;
        auVar130._20_4_ = auVar164._20_4_ * auVar10._20_4_;
        auVar130._24_4_ = auVar164._24_4_ * auVar10._24_4_;
        auVar130._28_4_ = 0;
        auVar125 = vfmsub231ps_fma(auVar130,auVar149,auVar24);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar125));
        auVar131._0_4_ = auVar127._0_4_ * auVar126._0_4_;
        auVar131._4_4_ = auVar127._4_4_ * auVar126._4_4_;
        auVar131._8_4_ = auVar127._8_4_ * auVar126._8_4_;
        auVar131._12_4_ = auVar127._12_4_ * auVar126._12_4_;
        auVar131._16_4_ = auVar127._16_4_ * auVar126._16_4_;
        auVar131._20_4_ = auVar127._20_4_ * auVar126._20_4_;
        auVar131._24_4_ = auVar127._24_4_ * auVar126._24_4_;
        auVar131._28_4_ = 0;
        auVar16 = vfmsub231ps_fma(auVar131,auVar25,auVar146);
        auVar43._4_4_ = auVar22._4_4_ * auVar146._4_4_;
        auVar43._0_4_ = auVar22._0_4_ * auVar146._0_4_;
        auVar43._8_4_ = auVar22._8_4_ * auVar146._8_4_;
        auVar43._12_4_ = auVar22._12_4_ * auVar146._12_4_;
        auVar43._16_4_ = auVar22._16_4_ * auVar146._16_4_;
        auVar43._20_4_ = auVar22._20_4_ * auVar146._20_4_;
        auVar43._24_4_ = auVar22._24_4_ * auVar146._24_4_;
        auVar43._28_4_ = auVar149._28_4_;
        auVar17 = vfmsub231ps_fma(auVar43,auVar133,auVar127);
        auVar44._4_4_ = auVar25._4_4_ * auVar133._4_4_;
        auVar44._0_4_ = auVar25._0_4_ * auVar133._0_4_;
        auVar44._8_4_ = auVar25._8_4_ * auVar133._8_4_;
        auVar44._12_4_ = auVar25._12_4_ * auVar133._12_4_;
        auVar44._16_4_ = auVar25._16_4_ * auVar133._16_4_;
        auVar44._20_4_ = auVar25._20_4_ * auVar133._20_4_;
        auVar44._24_4_ = auVar25._24_4_ * auVar133._24_4_;
        auVar44._28_4_ = auVar146._28_4_;
        auVar18 = vfmsub231ps_fma(auVar44,auVar22,auVar126);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar126 = vmaxps_avx(ZEXT1632(auVar125),ZEXT1632(auVar17));
        auVar126 = vcmpps_avx(auVar126,ZEXT832(0) << 0x20,2);
        auVar16 = vpackssdw_avx(auVar126._0_16_,auVar126._16_16_);
        auVar20 = vpand_avx(auVar16,auVar20);
        auVar126 = vpmovsxwd_avx2(auVar20);
        if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar126 >> 0x7f,0) == '\0') &&
              (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0xbf,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar126[0x1f]) {
LAB_0161508a:
          auVar183._8_8_ = local_500[1]._8_8_;
          auVar183._0_8_ = local_500[1]._0_8_;
          auVar183._16_8_ = local_500[1]._16_8_;
          auVar183._24_8_ = local_500[1]._24_8_;
        }
        else {
          auVar45._4_4_ = auVar164._4_4_ * auVar127._4_4_;
          auVar45._0_4_ = auVar164._0_4_ * auVar127._0_4_;
          auVar45._8_4_ = auVar164._8_4_ * auVar127._8_4_;
          auVar45._12_4_ = auVar164._12_4_ * auVar127._12_4_;
          auVar45._16_4_ = auVar164._16_4_ * auVar127._16_4_;
          auVar45._20_4_ = auVar164._20_4_ * auVar127._20_4_;
          auVar45._24_4_ = auVar164._24_4_ * auVar127._24_4_;
          auVar45._28_4_ = auVar126._28_4_;
          auVar123 = vfmsub231ps_fma(auVar45,auVar22,auVar24);
          auVar144._0_4_ = auVar24._0_4_ * auVar25._0_4_;
          auVar144._4_4_ = auVar24._4_4_ * auVar25._4_4_;
          auVar144._8_4_ = auVar24._8_4_ * auVar25._8_4_;
          auVar144._12_4_ = auVar24._12_4_ * auVar25._12_4_;
          auVar144._16_4_ = auVar24._16_4_ * auVar25._16_4_;
          auVar144._20_4_ = auVar24._20_4_ * auVar25._20_4_;
          auVar144._24_4_ = auVar24._24_4_ * auVar25._24_4_;
          auVar144._28_4_ = 0;
          auVar19 = vfmsub231ps_fma(auVar144,auVar23,auVar127);
          auVar46._4_4_ = auVar23._4_4_ * auVar22._4_4_;
          auVar46._0_4_ = auVar23._0_4_ * auVar22._0_4_;
          auVar46._8_4_ = auVar23._8_4_ * auVar22._8_4_;
          auVar46._12_4_ = auVar23._12_4_ * auVar22._12_4_;
          auVar46._16_4_ = auVar23._16_4_ * auVar22._16_4_;
          auVar46._20_4_ = auVar23._20_4_ * auVar22._20_4_;
          auVar46._24_4_ = auVar23._24_4_ * auVar22._24_4_;
          auVar46._28_4_ = auVar23._28_4_;
          auVar122 = vfmsub231ps_fma(auVar46,auVar25,auVar164);
          auVar16 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar19),ZEXT1632(auVar122));
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar123),_DAT_01faff00);
          auVar126 = vrcpps_avx(ZEXT1632(auVar18));
          auVar214._8_4_ = 0x3f800000;
          auVar214._0_8_ = 0x3f8000003f800000;
          auVar214._12_4_ = 0x3f800000;
          auVar214._16_4_ = 0x3f800000;
          auVar214._20_4_ = 0x3f800000;
          auVar214._24_4_ = 0x3f800000;
          auVar214._28_4_ = 0x3f800000;
          auVar16 = vfnmadd213ps_fma(auVar126,ZEXT1632(auVar18),auVar214);
          auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar126,auVar126);
          auVar47._4_4_ = auVar122._4_4_ * auVar10._4_4_;
          auVar47._0_4_ = auVar122._0_4_ * auVar10._0_4_;
          auVar47._8_4_ = auVar122._8_4_ * auVar10._8_4_;
          auVar47._12_4_ = auVar122._12_4_ * auVar10._12_4_;
          auVar47._16_4_ = auVar10._16_4_ * 0.0;
          auVar47._20_4_ = auVar10._20_4_ * 0.0;
          auVar47._24_4_ = auVar10._24_4_ * 0.0;
          auVar47._28_4_ = auVar10._28_4_;
          auVar19 = vfmadd231ps_fma(auVar47,auVar149,ZEXT1632(auVar19));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT1632(auVar123),local_540);
          fVar217 = auVar16._0_4_;
          fVar218 = auVar16._4_4_;
          fVar219 = auVar16._8_4_;
          fVar220 = auVar16._12_4_;
          auVar126 = ZEXT1632(CONCAT412(fVar220 * auVar19._12_4_,
                                        CONCAT48(fVar219 * auVar19._8_4_,
                                                 CONCAT44(fVar218 * auVar19._4_4_,
                                                          fVar217 * auVar19._0_4_))));
          auVar16 = vpermilps_avx((undefined1  [16])aVar7,0xff);
          auVar132._0_8_ = auVar16._0_8_;
          auVar132._8_8_ = auVar132._0_8_;
          auVar132._16_8_ = auVar132._0_8_;
          auVar132._24_8_ = auVar132._0_8_;
          fVar216 = (ray->super_RayK<1>).tfar;
          auVar145._4_4_ = fVar216;
          auVar145._0_4_ = fVar216;
          auVar145._8_4_ = fVar216;
          auVar145._12_4_ = fVar216;
          auVar145._16_4_ = fVar216;
          auVar145._20_4_ = fVar216;
          auVar145._24_4_ = fVar216;
          auVar145._28_4_ = fVar216;
          auVar149 = vcmpps_avx(auVar132,auVar126,2);
          auVar10 = vcmpps_avx(auVar126,auVar145,2);
          auVar149 = vandps_avx(auVar10,auVar149);
          auVar16 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
          auVar20 = vpand_avx(auVar20,auVar16);
          auVar149 = vpmovsxwd_avx2(auVar20);
          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar149 >> 0x7f,0) == '\0') &&
                (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar149 >> 0xbf,0) == '\0') &&
              (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar149[0x1f]) goto LAB_0161508a;
          auVar149 = vcmpps_avx(ZEXT1632(auVar18),ZEXT832(0) << 0x20,4);
          auVar16 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
          auVar20 = vpand_avx(auVar20,auVar16);
          auVar149 = vpmovsxwd_avx2(auVar20);
          auVar183._8_8_ = local_500[1]._8_8_;
          auVar183._0_8_ = local_500[1]._0_8_;
          auVar183._16_8_ = local_500[1]._16_8_;
          auVar183._24_8_ = local_500[1]._24_8_;
          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar149 >> 0x7f,0) != '\0') ||
                (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar149 >> 0xbf,0) != '\0') ||
              (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar149[0x1f] < '\0') {
            auVar133 = ZEXT1632(CONCAT412(fVar220 * auVar125._12_4_,
                                          CONCAT48(fVar219 * auVar125._8_4_,
                                                   CONCAT44(fVar218 * auVar125._4_4_,
                                                            fVar217 * auVar125._0_4_))));
            auVar146 = ZEXT1632(CONCAT412(fVar220 * auVar17._12_4_,
                                          CONCAT48(fVar219 * auVar17._8_4_,
                                                   CONCAT44(fVar218 * auVar17._4_4_,
                                                            fVar217 * auVar17._0_4_))));
            auVar182._8_4_ = 0x3f800000;
            auVar182._0_8_ = 0x3f8000003f800000;
            auVar182._12_4_ = 0x3f800000;
            auVar182._16_4_ = 0x3f800000;
            auVar182._20_4_ = 0x3f800000;
            auVar182._24_4_ = 0x3f800000;
            auVar182._28_4_ = 0x3f800000;
            auVar10 = vsubps_avx(auVar182,auVar133);
            _local_160 = vblendvps_avx(auVar10,auVar133,auVar21);
            auVar10 = vsubps_avx(auVar182,auVar146);
            local_3c0 = vblendvps_avx(auVar10,auVar146,auVar21);
            local_3a0 = auVar126;
            auVar183 = auVar149;
          }
        }
        auVar233 = ZEXT3264(local_680);
        auVar225 = ZEXT3264(_local_5a0);
        auVar215 = ZEXT3264(local_620);
        auVar175 = ZEXT3264(auVar209);
        auVar154 = ZEXT3264(auVar172);
        if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar183 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar183 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar183 >> 0x7f,0) == '\0') &&
              (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar183 >> 0xbf,0) == '\0') &&
            (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar183[0x1f]) {
          auVar154 = ZEXT3264(local_580);
          auVar175 = ZEXT3264(local_520);
          auVar202 = ZEXT3264(local_660);
        }
        else {
          auVar149 = vsubps_avx(local_760,local_600);
          auVar20 = vfmadd213ps_fma(auVar149,_local_160,local_600);
          fVar216 = pre->depth_scale;
          auVar48._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar216;
          auVar48._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar216;
          auVar48._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar216;
          auVar48._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar216;
          auVar48._16_4_ = fVar216 * 0.0;
          auVar48._20_4_ = fVar216 * 0.0;
          auVar48._24_4_ = fVar216 * 0.0;
          auVar48._28_4_ = 0;
          auVar149 = vcmpps_avx(local_3a0,auVar48,6);
          auVar10 = auVar183 & auVar149;
          auVar202 = ZEXT3264(local_660);
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            auVar147._8_4_ = 0xbf800000;
            auVar147._0_8_ = 0xbf800000bf800000;
            auVar147._12_4_ = 0xbf800000;
            auVar147._16_4_ = 0xbf800000;
            auVar147._20_4_ = 0xbf800000;
            auVar147._24_4_ = 0xbf800000;
            auVar147._28_4_ = 0xbf800000;
            auVar163._8_4_ = 0x40000000;
            auVar163._0_8_ = 0x4000000040000000;
            auVar163._12_4_ = 0x40000000;
            auVar163._16_4_ = 0x40000000;
            auVar163._20_4_ = 0x40000000;
            auVar163._24_4_ = 0x40000000;
            auVar163._28_4_ = 0x40000000;
            auVar20 = vfmadd213ps_fma(local_3c0,auVar163,auVar147);
            local_2a0 = _local_160;
            local_3c0 = ZEXT1632(auVar20);
            auVar10 = local_3c0;
            local_280 = ZEXT1632(auVar20);
            local_260 = local_3a0;
            local_240 = 0;
            local_23c = iVar13;
            local_230 = *(undefined8 *)*pauVar1;
            uStack_228 = *(undefined8 *)(*pauVar1 + 8);
            local_220 = *(undefined8 *)*pauVar2;
            uStack_218 = *(undefined8 *)(*pauVar2 + 8);
            local_210 = *(undefined8 *)*pauVar3;
            uStack_208 = *(undefined8 *)(*pauVar3 + 8);
            local_3c0 = auVar10;
            if ((pGVar115->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar149 = vandps_avx(auVar149,auVar183);
              local_500[0] = auVar149;
              fVar211 = 1.0 / auVar128._0_4_;
              local_1c0[0] = fVar211 * ((float)local_160._0_4_ + 0.0);
              local_1c0[1] = fVar211 * ((float)local_160._4_4_ + 1.0);
              local_1c0[2] = fVar211 * (fStack_158 + 2.0);
              local_1c0[3] = fVar211 * (fStack_154 + 3.0);
              fStack_1b0 = fVar211 * (fStack_150 + 4.0);
              fStack_1ac = fVar211 * (fStack_14c + 5.0);
              fStack_1a8 = fVar211 * (fStack_148 + 6.0);
              fStack_1a4 = fStack_144 + 7.0;
              local_3c0._0_8_ = auVar20._0_8_;
              local_3c0._8_8_ = auVar20._8_8_;
              local_1a0 = local_3c0._0_8_;
              uStack_198 = local_3c0._8_8_;
              uStack_190 = 0;
              uStack_188 = 0;
              local_180 = local_3a0;
              auVar148._8_4_ = 0x7f800000;
              auVar148._0_8_ = 0x7f8000007f800000;
              auVar148._12_4_ = 0x7f800000;
              auVar148._16_4_ = 0x7f800000;
              auVar148._20_4_ = 0x7f800000;
              auVar148._24_4_ = 0x7f800000;
              auVar148._28_4_ = 0x7f800000;
              auVar10 = vblendvps_avx(auVar148,local_3a0,auVar149);
              auVar126 = vshufps_avx(auVar10,auVar10,0xb1);
              auVar126 = vminps_avx(auVar10,auVar126);
              auVar133 = vshufpd_avx(auVar126,auVar126,5);
              auVar126 = vminps_avx(auVar126,auVar133);
              auVar133 = vpermpd_avx2(auVar126,0x4e);
              auVar126 = vminps_avx(auVar126,auVar133);
              auVar10 = vcmpps_avx(auVar10,auVar126,0);
              auVar126 = auVar149 & auVar10;
              if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar126 >> 0x7f,0) != '\0') ||
                    (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar126 >> 0xbf,0) != '\0') ||
                  (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar126[0x1f] < '\0') {
                auVar149 = vandps_avx(auVar10,auVar149);
              }
              uVar111 = vmovmskps_avx(auVar149);
              uVar26 = 0;
              for (; (uVar111 & 1) == 0; uVar111 = uVar111 >> 1 | 0x80000000) {
                uVar26 = uVar26 + 1;
              }
              uVar113 = (ulong)uVar26;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar115->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_780 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                do {
                  local_5c4 = local_1c0[uVar113];
                  local_5c0 = *(undefined4 *)((long)&local_1a0 + uVar113 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar113 * 4);
                  fVar211 = 1.0 - local_5c4;
                  auVar125 = ZEXT416((uint)local_5c4);
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,
                                            ZEXT416(0xc0a00000));
                  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_5c4 * local_5c4 * 3.0)),
                                            ZEXT416((uint)(local_5c4 + local_5c4)),auVar20);
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,
                                            ZEXT416(0x40000000));
                  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211 * -3.0)),
                                            ZEXT416((uint)(fVar211 + fVar211)),auVar20);
                  auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(local_5c4 * (fVar211 + fVar211))),
                                             ZEXT416((uint)fVar211),ZEXT416((uint)fVar211));
                  auVar125 = vfmadd231ss_fma(ZEXT416((uint)(local_5c4 * local_5c4)),auVar125,
                                             ZEXT416((uint)(fVar211 * -2.0)));
                  fVar211 = auVar20._0_4_ * 0.5;
                  fVar216 = auVar125._0_4_ * 0.5;
                  auVar180._0_4_ = fVar216 * local_700;
                  auVar180._4_4_ = fVar216 * fStack_6fc;
                  auVar180._8_4_ = fVar216 * fStack_6f8;
                  auVar180._12_4_ = fVar216 * fStack_6f4;
                  auVar160._4_4_ = fVar211;
                  auVar160._0_4_ = fVar211;
                  auVar160._8_4_ = fVar211;
                  auVar160._12_4_ = fVar211;
                  auVar100._8_8_ = uStack_6e8;
                  auVar100._0_8_ = local_6f0;
                  auVar20 = vfmadd132ps_fma(auVar160,auVar180,auVar100);
                  fVar211 = auVar16._0_4_ * 0.5;
                  auVar181._4_4_ = fVar211;
                  auVar181._0_4_ = fVar211;
                  auVar181._8_4_ = fVar211;
                  auVar181._12_4_ = fVar211;
                  auVar103._8_8_ = uStack_6d8;
                  auVar103._0_8_ = local_6e0;
                  auVar20 = vfmadd132ps_fma(auVar181,auVar20,auVar103);
                  fVar211 = auVar17._0_4_ * 0.5;
                  auVar161._4_4_ = fVar211;
                  auVar161._0_4_ = fVar211;
                  auVar161._8_4_ = fVar211;
                  auVar161._12_4_ = fVar211;
                  auVar106._8_8_ = uStack_6c8;
                  auVar106._0_8_ = local_6d0;
                  auVar20 = vfmadd132ps_fma(auVar161,auVar20,auVar106);
                  local_6b0.context = context->user;
                  local_5d0 = vmovlps_avx(auVar20);
                  local_5c8 = vextractps_avx(auVar20,2);
                  local_5bc = (int)local_728;
                  local_5b8 = (int)local_788;
                  local_5b4 = (local_6b0.context)->instID[0];
                  local_5b0 = (local_6b0.context)->instPrimID[0];
                  local_78c = -1;
                  local_6b0.valid = &local_78c;
                  local_6b0.geometryUserPtr = pGVar115->userPtr;
                  local_6b0.ray = (RTCRayN *)ray;
                  local_6b0.hit = (RTCHitN *)&local_5d0;
                  local_6b0.N = 1;
                  local_760._0_8_ = uVar113;
                  if (pGVar115->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016152fe:
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar115->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_6b0);
                      auVar225 = ZEXT3264(_local_5a0);
                      auVar175 = ZEXT3264(_local_560);
                      auVar215 = ZEXT3264(local_620);
                      auVar154 = ZEXT3264(local_640);
                      auVar233 = ZEXT3264(local_680);
                      auVar202 = ZEXT3264(local_660);
                      pre = local_6b8;
                      uVar113 = local_760._0_8_;
                      if (*local_6b0.valid == 0) goto LAB_016153f2;
                    }
                    (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_6b0.hit;
                    (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_6b0.hit + 4);
                    (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_6b0.hit + 8);
                    *(float *)((long)local_6b0.ray + 0x3c) = *(float *)(local_6b0.hit + 0xc);
                    *(float *)((long)local_6b0.ray + 0x40) = *(float *)(local_6b0.hit + 0x10);
                    *(float *)((long)local_6b0.ray + 0x44) = *(float *)(local_6b0.hit + 0x14);
                    *(float *)((long)local_6b0.ray + 0x48) = *(float *)(local_6b0.hit + 0x18);
                    *(float *)((long)local_6b0.ray + 0x4c) = *(float *)(local_6b0.hit + 0x1c);
                    *(float *)((long)local_6b0.ray + 0x50) = *(float *)(local_6b0.hit + 0x20);
                  }
                  else {
                    (*pGVar115->intersectionFilterN)(&local_6b0);
                    auVar225 = ZEXT3264(_local_5a0);
                    auVar175 = ZEXT3264(_local_560);
                    auVar215 = ZEXT3264(local_620);
                    auVar154 = ZEXT3264(local_640);
                    auVar233 = ZEXT3264(local_680);
                    auVar202 = ZEXT3264(local_660);
                    pre = local_6b8;
                    uVar113 = local_760._0_8_;
                    if (*local_6b0.valid != 0) goto LAB_016152fe;
LAB_016153f2:
                    (ray->super_RayK<1>).tfar = (float)local_780._0_4_;
                    pre = local_6b8;
                    uVar113 = local_760._0_8_;
                  }
                  auVar172 = auVar154._0_32_;
                  auVar209 = auVar175._0_32_;
                  *(undefined4 *)(local_500[0] + uVar113 * 4) = 0;
                  auVar126 = local_500[0];
                  fVar211 = (ray->super_RayK<1>).tfar;
                  auVar135._4_4_ = fVar211;
                  auVar135._0_4_ = fVar211;
                  auVar135._8_4_ = fVar211;
                  auVar135._12_4_ = fVar211;
                  auVar135._16_4_ = fVar211;
                  auVar135._20_4_ = fVar211;
                  auVar135._24_4_ = fVar211;
                  auVar135._28_4_ = fVar211;
                  auVar10 = vcmpps_avx(local_3a0,auVar135,2);
                  auVar149 = vandps_avx(auVar10,local_500[0]);
                  local_500[0] = auVar149;
                  auVar126 = auVar126 & auVar10;
                  prim = local_6c0;
                  if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar126 >> 0x7f,0) == '\0') &&
                        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar126 >> 0xbf,0) == '\0') &&
                      (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar126[0x1f]) goto LAB_01613841;
                  auVar153._8_4_ = 0x7f800000;
                  auVar153._0_8_ = 0x7f8000007f800000;
                  auVar153._12_4_ = 0x7f800000;
                  auVar153._16_4_ = 0x7f800000;
                  auVar153._20_4_ = 0x7f800000;
                  auVar153._24_4_ = 0x7f800000;
                  auVar153._28_4_ = 0x7f800000;
                  auVar10 = vblendvps_avx(auVar153,local_3a0,auVar149);
                  auVar126 = vshufps_avx(auVar10,auVar10,0xb1);
                  auVar126 = vminps_avx(auVar10,auVar126);
                  auVar133 = vshufpd_avx(auVar126,auVar126,5);
                  auVar126 = vminps_avx(auVar126,auVar133);
                  auVar133 = vpermpd_avx2(auVar126,0x4e);
                  auVar126 = vminps_avx(auVar126,auVar133);
                  auVar10 = vcmpps_avx(auVar10,auVar126,0);
                  auVar126 = auVar149 & auVar10;
                  if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar126 >> 0x7f,0) != '\0') ||
                        (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar126 >> 0xbf,0) != '\0') ||
                      (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar126[0x1f] < '\0') {
                    auVar149 = vandps_avx(auVar10,auVar149);
                  }
                  local_780 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  uVar112 = vmovmskps_avx(auVar149);
                  uVar110 = 0;
                  for (; (uVar112 & 1) == 0; uVar112 = uVar112 >> 1 | 0x80000000) {
                    uVar110 = uVar110 + 1;
                  }
                  uVar113 = (ulong)uVar110;
                } while( true );
              }
              fVar211 = local_1c0[uVar113];
              fVar216 = 1.0 - fVar211;
              auVar125 = ZEXT416((uint)fVar211);
              auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,ZEXT416(0xc0a00000))
              ;
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211 * 3.0)),
                                        ZEXT416((uint)(fVar211 + fVar211)),auVar20);
              auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,ZEXT416(0x40000000))
              ;
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar216 * -3.0)),
                                        ZEXT416((uint)(fVar216 + fVar216)),auVar20);
              auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar211 * (fVar216 + fVar216))),
                                         ZEXT416((uint)fVar216),ZEXT416((uint)fVar216));
              auVar125 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211)),auVar125,
                                         ZEXT416((uint)(fVar216 * -2.0)));
              fVar216 = auVar20._0_4_ * 0.5;
              fVar217 = auVar125._0_4_ * 0.5;
              auVar168._0_4_ = fVar217 * local_700;
              auVar168._4_4_ = fVar217 * fStack_6fc;
              auVar168._8_4_ = fVar217 * fStack_6f8;
              auVar168._12_4_ = fVar217 * fStack_6f4;
              auVar140._4_4_ = fVar216;
              auVar140._0_4_ = fVar216;
              auVar140._8_4_ = fVar216;
              auVar140._12_4_ = fVar216;
              auVar20 = vfmadd132ps_fma(auVar140,auVar168,*pauVar3);
              fVar216 = auVar16._0_4_ * 0.5;
              auVar169._4_4_ = fVar216;
              auVar169._0_4_ = fVar216;
              auVar169._8_4_ = fVar216;
              auVar169._12_4_ = fVar216;
              auVar20 = vfmadd132ps_fma(auVar169,auVar20,*pauVar2);
              fVar216 = *(float *)((long)&local_1a0 + uVar113 * 4);
              fVar217 = auVar17._0_4_ * 0.5;
              auVar156._4_4_ = fVar217;
              auVar156._0_4_ = fVar217;
              auVar156._8_4_ = fVar217;
              auVar156._12_4_ = fVar217;
              auVar20 = vfmadd132ps_fma(auVar156,auVar20,*pauVar1);
              (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar113 * 4);
              uVar119 = vmovlps_avx(auVar20);
              *(undefined8 *)&(ray->Ng).field_0 = uVar119;
              fVar217 = (float)vextractps_avx(auVar20,2);
              (ray->Ng).field_0.field_0.z = fVar217;
              ray->u = fVar211;
              ray->v = fVar216;
              ray->primID = uVar112;
              ray->geomID = uVar110;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              prim = local_6c0;
            }
            goto LAB_01613841;
          }
          auVar154 = ZEXT3264(local_580);
          auVar175 = ZEXT3264(local_520);
        }
      }
      if (8 < iVar13) {
        _local_5a0 = auVar225._0_32_;
        _local_560 = auVar209;
        local_620 = auVar215._0_32_;
        local_640 = auVar172;
        local_340._4_4_ = iVar13;
        local_340._0_4_ = iVar13;
        local_340._8_4_ = iVar13;
        local_340._12_4_ = iVar13;
        local_340._16_4_ = iVar13;
        local_340._20_4_ = iVar13;
        local_340._24_4_ = iVar13;
        local_340._28_4_ = iVar13;
        local_360._4_4_ = fVar211;
        local_360._0_4_ = fVar211;
        fStack_358 = fVar211;
        fStack_354 = fVar211;
        fStack_350 = fVar211;
        fStack_34c = fVar211;
        fStack_348 = fVar211;
        fStack_344 = fVar211;
        auVar20 = vpermilps_avx(local_4c0._0_16_,0xff);
        local_380._8_8_ = auVar20._0_8_;
        local_380._0_8_ = local_380._8_8_;
        local_380._16_8_ = local_380._8_8_;
        local_380._24_8_ = local_380._8_8_;
        local_120 = 1.0 / (float)local_480._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        lVar117 = 8;
        auVar11._8_8_ = uStack_498;
        auVar11._0_8_ = local_4a0;
        auVar11._16_8_ = uStack_490;
        auVar11._24_8_ = uStack_488;
LAB_0161423c:
        local_720 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar117 * 4 + lVar27);
        auVar149 = *(undefined1 (*) [32])(lVar27 + 0x21b37f0 + lVar117 * 4);
        auVar10 = *(undefined1 (*) [32])(lVar27 + 0x21b3c74 + lVar117 * 4);
        pauVar5 = (undefined1 (*) [32])(lVar27 + 0x21b40f8 + lVar117 * 4);
        auVar109 = *(undefined1 (*) [28])*pauVar5;
        auVar226._0_4_ = local_420 * *(float *)*pauVar5;
        auVar226._4_4_ = fStack_41c * *(float *)(*pauVar5 + 4);
        auVar226._8_4_ = fStack_418 * *(float *)(*pauVar5 + 8);
        auVar226._12_4_ = fStack_414 * *(float *)(*pauVar5 + 0xc);
        auVar226._16_4_ = fStack_410 * *(float *)(*pauVar5 + 0x10);
        auVar226._20_4_ = fStack_40c * *(float *)(*pauVar5 + 0x14);
        auVar226._28_36_ = auVar225._28_36_;
        auVar226._24_4_ = fStack_408 * *(float *)(*pauVar5 + 0x18);
        auVar49._4_4_ = local_140._4_4_ * *(float *)(*pauVar5 + 4);
        auVar49._0_4_ = (float)local_140 * *(float *)*pauVar5;
        auVar49._8_4_ = (float)uStack_138 * *(float *)(*pauVar5 + 8);
        auVar49._12_4_ = uStack_138._4_4_ * *(float *)(*pauVar5 + 0xc);
        auVar49._16_4_ = (float)uStack_130 * *(float *)(*pauVar5 + 0x10);
        auVar49._20_4_ = uStack_130._4_4_ * *(float *)(*pauVar5 + 0x14);
        auVar49._24_4_ = (float)uStack_128 * *(float *)(*pauVar5 + 0x18);
        auVar49._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
        auVar20 = vfmadd231ps_fma(auVar226._0_32_,auVar10,auVar154._0_32_);
        auVar16 = vfmadd231ps_fma(auVar49,auVar10,auVar175._0_32_);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar149,auVar202._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar149,local_440);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_720,auVar233._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_720,auVar11);
        auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar117 * 4 + lVar27);
        auVar133 = *(undefined1 (*) [32])(lVar27 + 0x21b5c10 + lVar117 * 4);
        auVar146 = *(undefined1 (*) [32])(lVar27 + 0x21b6094 + lVar117 * 4);
        pfVar6 = (float *)(lVar27 + 0x21b6518 + lVar117 * 4);
        fVar136 = *pfVar6;
        fVar222 = pfVar6[1];
        fVar227 = pfVar6[2];
        fVar83 = pfVar6[3];
        fVar84 = pfVar6[4];
        fVar85 = pfVar6[5];
        fVar86 = pfVar6[6];
        auVar225._0_4_ = local_420 * fVar136;
        auVar225._4_4_ = fStack_41c * fVar222;
        auVar225._8_4_ = fStack_418 * fVar227;
        auVar225._12_4_ = fStack_414 * fVar83;
        auVar225._16_4_ = fStack_410 * fVar84;
        auVar225._20_4_ = fStack_40c * fVar85;
        auVar225._28_36_ = auVar215._28_36_;
        auVar225._24_4_ = fStack_408 * fVar86;
        auVar50._4_4_ = local_140._4_4_ * fVar222;
        auVar50._0_4_ = (float)local_140 * fVar136;
        auVar50._8_4_ = (float)uStack_138 * fVar227;
        auVar50._12_4_ = uStack_138._4_4_ * fVar83;
        auVar50._16_4_ = (float)uStack_130 * fVar84;
        auVar50._20_4_ = uStack_130._4_4_ * fVar85;
        auVar50._24_4_ = (float)uStack_128 * fVar86;
        auVar50._28_4_ = fStack_404;
        auVar125 = vfmadd231ps_fma(auVar225._0_32_,auVar146,auVar154._0_32_);
        auVar17 = vfmadd231ps_fma(auVar50,auVar146,auVar175._0_32_);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar133,auVar202._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar133,local_440);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar126,auVar233._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar126,auVar11);
        local_2e0 = ZEXT1632(auVar125);
        local_320 = ZEXT1632(auVar20);
        local_600 = vsubps_avx(local_2e0,local_320);
        local_540 = ZEXT1632(auVar17);
        local_300 = ZEXT1632(auVar16);
        auVar164 = vsubps_avx(local_540,local_300);
        auVar82._4_4_ = local_600._4_4_ * auVar16._4_4_;
        auVar82._0_4_ = local_600._0_4_ * auVar16._0_4_;
        auVar82._8_4_ = local_600._8_4_ * auVar16._8_4_;
        auVar82._12_4_ = local_600._12_4_ * auVar16._12_4_;
        auVar82._16_4_ = local_600._16_4_ * 0.0;
        auVar82._20_4_ = local_600._20_4_ * 0.0;
        auVar82._24_4_ = local_600._24_4_ * 0.0;
        auVar82._28_4_ = local_440._28_4_;
        fVar211 = auVar164._0_4_;
        auVar175._0_4_ = auVar20._0_4_ * fVar211;
        fVar216 = auVar164._4_4_;
        auVar175._4_4_ = auVar20._4_4_ * fVar216;
        fVar217 = auVar164._8_4_;
        auVar175._8_4_ = auVar20._8_4_ * fVar217;
        fVar218 = auVar164._12_4_;
        auVar175._12_4_ = auVar20._12_4_ * fVar218;
        fVar219 = auVar164._16_4_;
        auVar175._16_4_ = fVar219 * 0.0;
        fVar220 = auVar164._20_4_;
        auVar175._20_4_ = fVar220 * 0.0;
        fVar221 = auVar164._24_4_;
        auVar175._28_36_ = auVar154._28_36_;
        auVar175._24_4_ = fVar221 * 0.0;
        auVar225 = ZEXT3264(*pauVar5);
        auVar15 = vsubps_avx(auVar82,auVar175._0_32_);
        auVar51._4_4_ = auVar109._4_4_ * local_e0._4_4_;
        auVar51._0_4_ = auVar109._0_4_ * (float)local_e0;
        auVar51._8_4_ = auVar109._8_4_ * (float)uStack_d8;
        auVar51._12_4_ = auVar109._12_4_ * uStack_d8._4_4_;
        auVar51._16_4_ = auVar109._16_4_ * (float)uStack_d0;
        auVar51._20_4_ = auVar109._20_4_ * uStack_d0._4_4_;
        auVar51._24_4_ = auVar109._24_4_ * (float)uStack_c8;
        auVar51._28_4_ = local_440._28_4_;
        auVar20 = vfmadd231ps_fma(auVar51,auVar10,local_c0);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar149,local_a0);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),local_80,local_720);
        auVar52._4_4_ = local_e0._4_4_ * fVar222;
        auVar52._0_4_ = (float)local_e0 * fVar136;
        auVar52._8_4_ = (float)uStack_d8 * fVar227;
        auVar52._12_4_ = uStack_d8._4_4_ * fVar83;
        auVar52._16_4_ = (float)uStack_d0 * fVar84;
        auVar52._20_4_ = uStack_d0._4_4_ * fVar85;
        auVar52._24_4_ = (float)uStack_c8 * fVar86;
        auVar52._28_4_ = uStack_c8._4_4_;
        auVar16 = vfmadd231ps_fma(auVar52,auVar146,local_c0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar133,local_a0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar126,local_80);
        auVar53._4_4_ = fVar216 * fVar216;
        auVar53._0_4_ = fVar211 * fVar211;
        auVar53._8_4_ = fVar217 * fVar217;
        auVar53._12_4_ = fVar218 * fVar218;
        auVar53._16_4_ = fVar219 * fVar219;
        auVar53._20_4_ = fVar220 * fVar220;
        auVar53._24_4_ = fVar221 * fVar221;
        auVar53._28_4_ = uStack_128._4_4_;
        auVar125 = vfmadd231ps_fma(auVar53,local_600,local_600);
        local_460 = ZEXT1632(auVar20);
        auVar200 = vmaxps_avx(local_460,ZEXT1632(auVar16));
        fVar211 = auVar200._0_4_ * auVar200._0_4_;
        fVar216 = auVar200._4_4_ * auVar200._4_4_;
        fVar217 = auVar200._8_4_ * auVar200._8_4_;
        fVar218 = auVar200._12_4_ * auVar200._12_4_;
        fVar219 = auVar200._16_4_ * auVar200._16_4_;
        fVar220 = auVar200._20_4_ * auVar200._20_4_;
        fVar221 = auVar200._24_4_ * auVar200._24_4_;
        auVar215 = ZEXT3264(CONCAT428(auVar200._28_4_,
                                      CONCAT424(fVar221,CONCAT420(fVar220,CONCAT416(fVar219,
                                                  CONCAT412(fVar218,CONCAT48(fVar217,CONCAT44(
                                                  fVar216,fVar211))))))));
        auVar205._0_4_ = fVar211 * auVar125._0_4_;
        auVar205._4_4_ = fVar216 * auVar125._4_4_;
        auVar205._8_4_ = fVar217 * auVar125._8_4_;
        auVar205._12_4_ = fVar218 * auVar125._12_4_;
        auVar205._16_4_ = fVar219 * 0.0;
        auVar205._20_4_ = fVar220 * 0.0;
        auVar205._24_4_ = fVar221 * 0.0;
        auVar205._28_4_ = 0;
        auVar54._4_4_ = auVar15._4_4_ * auVar15._4_4_;
        auVar54._0_4_ = auVar15._0_4_ * auVar15._0_4_;
        auVar54._8_4_ = auVar15._8_4_ * auVar15._8_4_;
        auVar54._12_4_ = auVar15._12_4_ * auVar15._12_4_;
        auVar54._16_4_ = auVar15._16_4_ * auVar15._16_4_;
        auVar54._20_4_ = auVar15._20_4_ * auVar15._20_4_;
        auVar54._24_4_ = auVar15._24_4_ * auVar15._24_4_;
        auVar54._28_4_ = auVar15._28_4_;
        auVar200 = vcmpps_avx(auVar54,auVar205,2);
        local_240 = (int)lVar117;
        auVar206._4_4_ = local_240;
        auVar206._0_4_ = local_240;
        auVar206._8_4_ = local_240;
        auVar206._12_4_ = local_240;
        auVar206._16_4_ = local_240;
        auVar206._20_4_ = local_240;
        auVar206._24_4_ = local_240;
        auVar206._28_4_ = local_240;
        auVar15 = vpor_avx2(auVar206,_DAT_01fe9900);
        auVar21 = vpcmpgtd_avx2(local_340,auVar15);
        auVar15 = auVar21 & auVar200;
        if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar15 >> 0x7f,0) != '\0') ||
              (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0xbf,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar15[0x1f] < '\0') {
          local_480 = vandps_avx(auVar21,auVar200);
          auVar55._4_4_ = (float)local_5a0._4_4_ * fVar222;
          auVar55._0_4_ = (float)local_5a0._0_4_ * fVar136;
          auVar55._8_4_ = fStack_598 * fVar227;
          auVar55._12_4_ = fStack_594 * fVar83;
          auVar55._16_4_ = fStack_590 * fVar84;
          auVar55._20_4_ = fStack_58c * fVar85;
          auVar55._24_4_ = fStack_588 * fVar86;
          auVar55._28_4_ = auVar200._28_4_;
          auVar20 = vfmadd213ps_fma(auVar146,_local_560,auVar55);
          auVar20 = vfmadd213ps_fma(auVar133,local_620,ZEXT1632(auVar20));
          auVar20 = vfmadd213ps_fma(auVar126,local_640,ZEXT1632(auVar20));
          auVar56._4_4_ = (float)local_5a0._4_4_ * auVar109._4_4_;
          auVar56._0_4_ = (float)local_5a0._0_4_ * auVar109._0_4_;
          auVar56._8_4_ = fStack_598 * auVar109._8_4_;
          auVar56._12_4_ = fStack_594 * auVar109._12_4_;
          auVar56._16_4_ = fStack_590 * auVar109._16_4_;
          auVar56._20_4_ = fStack_58c * auVar109._20_4_;
          auVar56._24_4_ = fStack_588 * auVar109._24_4_;
          auVar56._28_4_ = auVar200._28_4_;
          auVar125 = vfmadd213ps_fma(auVar10,_local_560,auVar56);
          auVar125 = vfmadd213ps_fma(auVar149,local_620,ZEXT1632(auVar125));
          auVar149 = *(undefined1 (*) [32])(lVar27 + 0x21b457c + lVar117 * 4);
          auVar10 = *(undefined1 (*) [32])(lVar27 + 0x21b4a00 + lVar117 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar27 + 0x21b4e84 + lVar117 * 4);
          pfVar6 = (float *)(lVar27 + 0x21b5308 + lVar117 * 4);
          fVar211 = *pfVar6;
          fVar216 = pfVar6[1];
          fVar217 = pfVar6[2];
          fVar218 = pfVar6[3];
          fVar219 = pfVar6[4];
          fVar220 = pfVar6[5];
          fVar221 = pfVar6[6];
          auVar57._4_4_ = fStack_41c * fVar216;
          auVar57._0_4_ = local_420 * fVar211;
          auVar57._8_4_ = fStack_418 * fVar217;
          auVar57._12_4_ = fStack_414 * fVar218;
          auVar57._16_4_ = fStack_410 * fVar219;
          auVar57._20_4_ = fStack_40c * fVar220;
          auVar57._24_4_ = fStack_408 * fVar221;
          auVar57._28_4_ = local_600._28_4_;
          auVar58._4_4_ = local_140._4_4_ * fVar216;
          auVar58._0_4_ = (float)local_140 * fVar211;
          auVar58._8_4_ = (float)uStack_138 * fVar217;
          auVar58._12_4_ = uStack_138._4_4_ * fVar218;
          auVar58._16_4_ = (float)uStack_130 * fVar219;
          auVar58._20_4_ = uStack_130._4_4_ * fVar220;
          auVar58._24_4_ = (float)uStack_128 * fVar221;
          auVar58._28_4_ = *(undefined4 *)(*pauVar5 + 0x1c);
          auVar59._4_4_ = fVar216 * (float)local_5a0._4_4_;
          auVar59._0_4_ = fVar211 * (float)local_5a0._0_4_;
          auVar59._8_4_ = fVar217 * fStack_598;
          auVar59._12_4_ = fVar218 * fStack_594;
          auVar59._16_4_ = fVar219 * fStack_590;
          auVar59._20_4_ = fVar220 * fStack_58c;
          auVar59._24_4_ = fVar221 * fStack_588;
          auVar59._28_4_ = pfVar6[7];
          auVar17 = vfmadd231ps_fma(auVar57,auVar126,local_580);
          auVar18 = vfmadd231ps_fma(auVar58,auVar126,local_520);
          auVar19 = vfmadd231ps_fma(auVar59,_local_560,auVar126);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar10,local_660);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar10,local_440);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_620,auVar10);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar149,local_680);
          auVar108._8_8_ = uStack_498;
          auVar108._0_8_ = local_4a0;
          auVar108._16_8_ = uStack_490;
          auVar108._24_8_ = uStack_488;
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar149,auVar108);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_640,auVar149);
          pfVar6 = (float *)(lVar27 + 0x21b7728 + lVar117 * 4);
          fVar211 = *pfVar6;
          fVar216 = pfVar6[1];
          fVar217 = pfVar6[2];
          fVar218 = pfVar6[3];
          fVar219 = pfVar6[4];
          fVar220 = pfVar6[5];
          fVar221 = pfVar6[6];
          auVar60._4_4_ = fStack_41c * fVar216;
          auVar60._0_4_ = local_420 * fVar211;
          auVar60._8_4_ = fStack_418 * fVar217;
          auVar60._12_4_ = fStack_414 * fVar218;
          auVar60._16_4_ = fStack_410 * fVar219;
          auVar60._20_4_ = fStack_40c * fVar220;
          auVar60._24_4_ = fStack_408 * fVar221;
          auVar60._28_4_ = fStack_404;
          auVar61._4_4_ = local_140._4_4_ * fVar216;
          auVar61._0_4_ = (float)local_140 * fVar211;
          auVar61._8_4_ = (float)uStack_138 * fVar217;
          auVar61._12_4_ = uStack_138._4_4_ * fVar218;
          auVar61._16_4_ = (float)uStack_130 * fVar219;
          auVar61._20_4_ = uStack_130._4_4_ * fVar220;
          auVar61._24_4_ = (float)uStack_128 * fVar221;
          auVar61._28_4_ = local_640._28_4_;
          auVar62._4_4_ = fVar216 * (float)local_5a0._4_4_;
          auVar62._0_4_ = fVar211 * (float)local_5a0._0_4_;
          auVar62._8_4_ = fVar217 * fStack_598;
          auVar62._12_4_ = fVar218 * fStack_594;
          auVar62._16_4_ = fVar219 * fStack_590;
          auVar62._20_4_ = fVar220 * fStack_58c;
          auVar62._24_4_ = fVar221 * fStack_588;
          auVar62._28_4_ = pfVar6[7];
          auVar149 = *(undefined1 (*) [32])(lVar27 + 0x21b72a4 + lVar117 * 4);
          auVar123 = vfmadd231ps_fma(auVar60,auVar149,local_580);
          auVar122 = vfmadd231ps_fma(auVar61,auVar149,local_520);
          auVar155 = vfmadd231ps_fma(auVar62,_local_560,auVar149);
          auVar149 = *(undefined1 (*) [32])(lVar27 + 0x21b6e20 + lVar117 * 4);
          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar149,local_660);
          auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar149,local_440);
          auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar149,local_620);
          auVar149 = *(undefined1 (*) [32])(lVar27 + 0x21b699c + lVar117 * 4);
          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar149,local_680);
          auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar149,auVar108);
          auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),local_640,auVar149);
          auVar207._8_4_ = 0x7fffffff;
          auVar207._0_8_ = 0x7fffffff7fffffff;
          auVar207._12_4_ = 0x7fffffff;
          auVar207._16_4_ = 0x7fffffff;
          auVar207._20_4_ = 0x7fffffff;
          auVar207._24_4_ = 0x7fffffff;
          auVar207._28_4_ = 0x7fffffff;
          auVar149 = vandps_avx(ZEXT1632(auVar17),auVar207);
          auVar10 = vandps_avx(ZEXT1632(auVar18),auVar207);
          auVar10 = vmaxps_avx(auVar149,auVar10);
          auVar149 = vandps_avx(ZEXT1632(auVar19),auVar207);
          auVar149 = vmaxps_avx(auVar10,auVar149);
          auVar149 = vcmpps_avx(auVar149,_local_360,1);
          auVar126 = vblendvps_avx(ZEXT1632(auVar17),local_600,auVar149);
          auVar133 = vblendvps_avx(ZEXT1632(auVar18),auVar164,auVar149);
          auVar149 = vandps_avx(ZEXT1632(auVar123),auVar207);
          auVar10 = vandps_avx(ZEXT1632(auVar122),auVar207);
          auVar10 = vmaxps_avx(auVar149,auVar10);
          auVar149 = vandps_avx(auVar207,ZEXT1632(auVar155));
          auVar149 = vmaxps_avx(auVar10,auVar149);
          auVar10 = vcmpps_avx(auVar149,_local_360,1);
          auVar149 = vblendvps_avx(ZEXT1632(auVar123),local_600,auVar10);
          auVar10 = vblendvps_avx(ZEXT1632(auVar122),auVar164,auVar10);
          auVar125 = vfmadd213ps_fma(local_720,local_640,ZEXT1632(auVar125));
          auVar17 = vfmadd213ps_fma(auVar126,auVar126,ZEXT832(0) << 0x20);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar133,auVar133);
          auVar146 = vrsqrtps_avx(ZEXT1632(auVar17));
          fVar211 = auVar146._0_4_;
          fVar216 = auVar146._4_4_;
          fVar217 = auVar146._8_4_;
          fVar218 = auVar146._12_4_;
          fVar219 = auVar146._16_4_;
          fVar220 = auVar146._20_4_;
          fVar221 = auVar146._24_4_;
          auVar63._4_4_ = fVar216 * fVar216 * fVar216 * auVar17._4_4_ * -0.5;
          auVar63._0_4_ = fVar211 * fVar211 * fVar211 * auVar17._0_4_ * -0.5;
          auVar63._8_4_ = fVar217 * fVar217 * fVar217 * auVar17._8_4_ * -0.5;
          auVar63._12_4_ = fVar218 * fVar218 * fVar218 * auVar17._12_4_ * -0.5;
          auVar63._16_4_ = fVar219 * fVar219 * fVar219 * -0.0;
          auVar63._20_4_ = fVar220 * fVar220 * fVar220 * -0.0;
          auVar63._24_4_ = fVar221 * fVar221 * fVar221 * -0.0;
          auVar63._28_4_ = 0;
          auVar231._8_4_ = 0x3fc00000;
          auVar231._0_8_ = 0x3fc000003fc00000;
          auVar231._12_4_ = 0x3fc00000;
          auVar231._16_4_ = 0x3fc00000;
          auVar231._20_4_ = 0x3fc00000;
          auVar231._24_4_ = 0x3fc00000;
          auVar231._28_4_ = 0x3fc00000;
          auVar17 = vfmadd231ps_fma(auVar63,auVar231,auVar146);
          fVar211 = auVar17._0_4_;
          fVar216 = auVar17._4_4_;
          auVar64._4_4_ = auVar133._4_4_ * fVar216;
          auVar64._0_4_ = auVar133._0_4_ * fVar211;
          fVar217 = auVar17._8_4_;
          auVar64._8_4_ = auVar133._8_4_ * fVar217;
          fVar218 = auVar17._12_4_;
          auVar64._12_4_ = auVar133._12_4_ * fVar218;
          auVar64._16_4_ = auVar133._16_4_ * 0.0;
          auVar64._20_4_ = auVar133._20_4_ * 0.0;
          auVar64._24_4_ = auVar133._24_4_ * 0.0;
          auVar64._28_4_ = auVar146._28_4_;
          auVar65._4_4_ = fVar216 * -auVar126._4_4_;
          auVar65._0_4_ = fVar211 * -auVar126._0_4_;
          auVar65._8_4_ = fVar217 * -auVar126._8_4_;
          auVar65._12_4_ = fVar218 * -auVar126._12_4_;
          auVar65._16_4_ = -auVar126._16_4_ * 0.0;
          auVar65._20_4_ = -auVar126._20_4_ * 0.0;
          auVar65._24_4_ = -auVar126._24_4_ * 0.0;
          auVar65._28_4_ = auVar133._28_4_;
          auVar17 = vfmadd213ps_fma(auVar149,auVar149,ZEXT832(0) << 0x20);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar10,auVar10);
          auVar126 = vrsqrtps_avx(ZEXT1632(auVar17));
          auVar66._28_4_ = local_560._28_4_;
          auVar66._0_28_ =
               ZEXT1628(CONCAT412(fVar218 * 0.0,
                                  CONCAT48(fVar217 * 0.0,CONCAT44(fVar216 * 0.0,fVar211 * 0.0))));
          fVar211 = auVar126._0_4_;
          fVar216 = auVar126._4_4_;
          fVar217 = auVar126._8_4_;
          fVar218 = auVar126._12_4_;
          fVar219 = auVar126._16_4_;
          fVar220 = auVar126._20_4_;
          fVar221 = auVar126._24_4_;
          auVar67._4_4_ = fVar216 * fVar216 * fVar216 * auVar17._4_4_ * -0.5;
          auVar67._0_4_ = fVar211 * fVar211 * fVar211 * auVar17._0_4_ * -0.5;
          auVar67._8_4_ = fVar217 * fVar217 * fVar217 * auVar17._8_4_ * -0.5;
          auVar67._12_4_ = fVar218 * fVar218 * fVar218 * auVar17._12_4_ * -0.5;
          auVar67._16_4_ = fVar219 * fVar219 * fVar219 * -0.0;
          auVar67._20_4_ = fVar220 * fVar220 * fVar220 * -0.0;
          auVar67._24_4_ = fVar221 * fVar221 * fVar221 * -0.0;
          auVar67._28_4_ = 0;
          auVar17 = vfmadd231ps_fma(auVar67,auVar231,auVar126);
          fVar211 = auVar17._0_4_;
          fVar216 = auVar17._4_4_;
          auVar68._4_4_ = auVar10._4_4_ * fVar216;
          auVar68._0_4_ = auVar10._0_4_ * fVar211;
          fVar217 = auVar17._8_4_;
          auVar68._8_4_ = auVar10._8_4_ * fVar217;
          fVar218 = auVar17._12_4_;
          auVar68._12_4_ = auVar10._12_4_ * fVar218;
          auVar68._16_4_ = auVar10._16_4_ * 0.0;
          auVar68._20_4_ = auVar10._20_4_ * 0.0;
          auVar68._24_4_ = auVar10._24_4_ * 0.0;
          auVar68._28_4_ = 0;
          auVar69._4_4_ = fVar216 * -auVar149._4_4_;
          auVar69._0_4_ = fVar211 * -auVar149._0_4_;
          auVar69._8_4_ = fVar217 * -auVar149._8_4_;
          auVar69._12_4_ = fVar218 * -auVar149._12_4_;
          auVar69._16_4_ = -auVar149._16_4_ * 0.0;
          auVar69._20_4_ = -auVar149._20_4_ * 0.0;
          auVar69._24_4_ = -auVar149._24_4_ * 0.0;
          auVar69._28_4_ = auVar126._28_4_;
          auVar70._28_4_ = 0xbf000000;
          auVar70._0_28_ =
               ZEXT1628(CONCAT412(fVar218 * 0.0,
                                  CONCAT48(fVar217 * 0.0,CONCAT44(fVar216 * 0.0,fVar211 * 0.0))));
          auVar17 = vfmadd213ps_fma(auVar64,local_460,local_320);
          auVar18 = vfmadd213ps_fma(auVar65,local_460,local_300);
          auVar19 = vfmadd213ps_fma(auVar66,local_460,ZEXT1632(auVar125));
          auVar138 = vfnmadd213ps_fma(auVar64,local_460,local_320);
          auVar123 = vfmadd213ps_fma(auVar68,ZEXT1632(auVar16),local_2e0);
          auVar121 = vfnmadd213ps_fma(auVar65,local_460,local_300);
          auVar149 = ZEXT1632(auVar16);
          auVar122 = vfmadd213ps_fma(auVar69,auVar149,local_540);
          auVar177 = vfnmadd231ps_fma(ZEXT1632(auVar125),local_460,auVar66);
          auVar125 = vfmadd213ps_fma(auVar70,auVar149,ZEXT1632(auVar20));
          auVar139 = vfnmadd213ps_fma(auVar68,auVar149,local_2e0);
          auVar166 = vfnmadd213ps_fma(auVar69,auVar149,local_540);
          auVar120 = vfnmadd231ps_fma(ZEXT1632(auVar20),ZEXT1632(auVar16),auVar70);
          local_4c0 = ZEXT1632(auVar120);
          auVar149 = vsubps_avx(ZEXT1632(auVar122),ZEXT1632(auVar121));
          auVar10 = vsubps_avx(ZEXT1632(auVar125),ZEXT1632(auVar177));
          auVar71._4_4_ = auVar149._4_4_ * auVar177._4_4_;
          auVar71._0_4_ = auVar149._0_4_ * auVar177._0_4_;
          auVar71._8_4_ = auVar149._8_4_ * auVar177._8_4_;
          auVar71._12_4_ = auVar149._12_4_ * auVar177._12_4_;
          auVar71._16_4_ = auVar149._16_4_ * 0.0;
          auVar71._20_4_ = auVar149._20_4_ * 0.0;
          auVar71._24_4_ = auVar149._24_4_ * 0.0;
          auVar71._28_4_ = 0;
          auVar155 = vfmsub231ps_fma(auVar71,ZEXT1632(auVar121),auVar10);
          auVar72._4_4_ = auVar138._4_4_ * auVar10._4_4_;
          auVar72._0_4_ = auVar138._0_4_ * auVar10._0_4_;
          auVar72._8_4_ = auVar138._8_4_ * auVar10._8_4_;
          auVar72._12_4_ = auVar138._12_4_ * auVar10._12_4_;
          auVar72._16_4_ = auVar10._16_4_ * 0.0;
          auVar72._20_4_ = auVar10._20_4_ * 0.0;
          auVar72._24_4_ = auVar10._24_4_ * 0.0;
          auVar72._28_4_ = auVar10._28_4_;
          auVar146 = ZEXT1632(auVar138);
          auVar10 = vsubps_avx(ZEXT1632(auVar123),auVar146);
          auVar164 = ZEXT1632(auVar177);
          auVar20 = vfmsub231ps_fma(auVar72,auVar164,auVar10);
          auVar73._4_4_ = auVar121._4_4_ * auVar10._4_4_;
          auVar73._0_4_ = auVar121._0_4_ * auVar10._0_4_;
          auVar73._8_4_ = auVar121._8_4_ * auVar10._8_4_;
          auVar73._12_4_ = auVar121._12_4_ * auVar10._12_4_;
          auVar73._16_4_ = auVar10._16_4_ * 0.0;
          auVar73._20_4_ = auVar10._20_4_ * 0.0;
          auVar73._24_4_ = auVar10._24_4_ * 0.0;
          auVar73._28_4_ = auVar10._28_4_;
          auVar138 = vfmsub231ps_fma(auVar73,auVar146,auVar149);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar138),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT832(0) << 0x20,ZEXT1632(auVar155));
          auVar15 = vcmpps_avx(ZEXT1632(auVar20),ZEXT832(0) << 0x20,2);
          local_760 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar17),auVar15);
          auVar149 = vblendvps_avx(ZEXT1632(auVar166),ZEXT1632(auVar18),auVar15);
          local_780 = vblendvps_avx(ZEXT1632(auVar120),ZEXT1632(auVar19),auVar15);
          auVar225 = ZEXT3264(local_780);
          auVar10 = vblendvps_avx(auVar146,ZEXT1632(auVar123),auVar15);
          auVar126 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar122),auVar15);
          auVar133 = vblendvps_avx(auVar164,ZEXT1632(auVar125),auVar15);
          auVar146 = vblendvps_avx(ZEXT1632(auVar123),auVar146,auVar15);
          auVar200 = vblendvps_avx(ZEXT1632(auVar122),ZEXT1632(auVar121),auVar15);
          auVar20 = vpackssdw_avx(local_480._0_16_,local_480._16_16_);
          local_720 = ZEXT1632(auVar20);
          auVar164 = vblendvps_avx(ZEXT1632(auVar125),auVar164,auVar15);
          auVar146 = vsubps_avx(auVar146,local_760);
          auVar200 = vsubps_avx(auVar200,auVar149);
          auVar21 = vsubps_avx(auVar164,local_780);
          auVar23 = vsubps_avx(local_760,auVar10);
          auVar24 = vsubps_avx(auVar149,auVar126);
          auVar215 = ZEXT3264(auVar24);
          auVar25 = vsubps_avx(local_780,auVar133);
          auVar189._0_4_ = auVar21._0_4_ * local_760._0_4_;
          auVar189._4_4_ = auVar21._4_4_ * local_760._4_4_;
          auVar189._8_4_ = auVar21._8_4_ * local_760._8_4_;
          auVar189._12_4_ = auVar21._12_4_ * local_760._12_4_;
          auVar189._16_4_ = auVar21._16_4_ * local_760._16_4_;
          auVar189._20_4_ = auVar21._20_4_ * local_760._20_4_;
          auVar189._24_4_ = auVar21._24_4_ * local_760._24_4_;
          auVar189._28_4_ = 0;
          auVar125 = vfmsub231ps_fma(auVar189,local_780,auVar146);
          auVar74._4_4_ = auVar146._4_4_ * auVar149._4_4_;
          auVar74._0_4_ = auVar146._0_4_ * auVar149._0_4_;
          auVar74._8_4_ = auVar146._8_4_ * auVar149._8_4_;
          auVar74._12_4_ = auVar146._12_4_ * auVar149._12_4_;
          auVar74._16_4_ = auVar146._16_4_ * auVar149._16_4_;
          auVar74._20_4_ = auVar146._20_4_ * auVar149._20_4_;
          auVar74._24_4_ = auVar146._24_4_ * auVar149._24_4_;
          auVar74._28_4_ = auVar164._28_4_;
          auVar17 = vfmsub231ps_fma(auVar74,local_760,auVar200);
          auVar125 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar125));
          auVar190._0_4_ = auVar200._0_4_ * local_780._0_4_;
          auVar190._4_4_ = auVar200._4_4_ * local_780._4_4_;
          auVar190._8_4_ = auVar200._8_4_ * local_780._8_4_;
          auVar190._12_4_ = auVar200._12_4_ * local_780._12_4_;
          auVar190._16_4_ = auVar200._16_4_ * local_780._16_4_;
          auVar190._20_4_ = auVar200._20_4_ * local_780._20_4_;
          auVar190._24_4_ = auVar200._24_4_ * local_780._24_4_;
          auVar190._28_4_ = 0;
          auVar17 = vfmsub231ps_fma(auVar190,auVar149,auVar21);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar191._0_4_ = auVar25._0_4_ * auVar10._0_4_;
          auVar191._4_4_ = auVar25._4_4_ * auVar10._4_4_;
          auVar191._8_4_ = auVar25._8_4_ * auVar10._8_4_;
          auVar191._12_4_ = auVar25._12_4_ * auVar10._12_4_;
          auVar191._16_4_ = auVar25._16_4_ * auVar10._16_4_;
          auVar191._20_4_ = auVar25._20_4_ * auVar10._20_4_;
          auVar191._24_4_ = auVar25._24_4_ * auVar10._24_4_;
          auVar191._28_4_ = 0;
          auVar125 = vfmsub231ps_fma(auVar191,auVar23,auVar133);
          auVar75._4_4_ = auVar24._4_4_ * auVar133._4_4_;
          auVar75._0_4_ = auVar24._0_4_ * auVar133._0_4_;
          auVar75._8_4_ = auVar24._8_4_ * auVar133._8_4_;
          auVar75._12_4_ = auVar24._12_4_ * auVar133._12_4_;
          auVar75._16_4_ = auVar24._16_4_ * auVar133._16_4_;
          auVar75._20_4_ = auVar24._20_4_ * auVar133._20_4_;
          auVar75._24_4_ = auVar24._24_4_ * auVar133._24_4_;
          auVar75._28_4_ = auVar133._28_4_;
          auVar18 = vfmsub231ps_fma(auVar75,auVar126,auVar25);
          auVar76._4_4_ = auVar23._4_4_ * auVar126._4_4_;
          auVar76._0_4_ = auVar23._0_4_ * auVar126._0_4_;
          auVar76._8_4_ = auVar23._8_4_ * auVar126._8_4_;
          auVar76._12_4_ = auVar23._12_4_ * auVar126._12_4_;
          auVar76._16_4_ = auVar23._16_4_ * auVar126._16_4_;
          auVar76._20_4_ = auVar23._20_4_ * auVar126._20_4_;
          auVar76._24_4_ = auVar23._24_4_ * auVar126._24_4_;
          auVar76._28_4_ = auVar126._28_4_;
          auVar19 = vfmsub231ps_fma(auVar76,auVar24,auVar10);
          auVar126 = ZEXT832(0) << 0x20;
          auVar125 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar126,ZEXT1632(auVar125));
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar125),auVar126,ZEXT1632(auVar18));
          auVar10 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar18));
          auVar10 = vcmpps_avx(auVar10,ZEXT832(0) << 0x20,2);
          auVar125 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
          auVar20 = vpand_avx(auVar125,auVar20);
          auVar10 = vpmovsxwd_avx2(auVar20);
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar10 >> 0x7f,0) == '\0') &&
                (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar10 >> 0xbf,0) == '\0') &&
              (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar10[0x1f]) {
LAB_01614d13:
            auVar174._8_8_ = local_500[1]._8_8_;
            auVar174._0_8_ = local_500[1]._0_8_;
            auVar174._16_8_ = local_500[1]._16_8_;
            auVar174._24_8_ = local_500[1]._24_8_;
          }
          else {
            auVar77._4_4_ = auVar200._4_4_ * auVar25._4_4_;
            auVar77._0_4_ = auVar200._0_4_ * auVar25._0_4_;
            auVar77._8_4_ = auVar200._8_4_ * auVar25._8_4_;
            auVar77._12_4_ = auVar200._12_4_ * auVar25._12_4_;
            auVar77._16_4_ = auVar200._16_4_ * auVar25._16_4_;
            auVar77._20_4_ = auVar200._20_4_ * auVar25._20_4_;
            auVar77._24_4_ = auVar200._24_4_ * auVar25._24_4_;
            auVar77._28_4_ = auVar10._28_4_;
            auVar122 = vfmsub231ps_fma(auVar77,auVar24,auVar21);
            auVar194._0_4_ = auVar23._0_4_ * auVar21._0_4_;
            auVar194._4_4_ = auVar23._4_4_ * auVar21._4_4_;
            auVar194._8_4_ = auVar23._8_4_ * auVar21._8_4_;
            auVar194._12_4_ = auVar23._12_4_ * auVar21._12_4_;
            auVar194._16_4_ = auVar23._16_4_ * auVar21._16_4_;
            auVar194._20_4_ = auVar23._20_4_ * auVar21._20_4_;
            auVar194._24_4_ = auVar23._24_4_ * auVar21._24_4_;
            auVar194._28_4_ = 0;
            auVar123 = vfmsub231ps_fma(auVar194,auVar146,auVar25);
            auVar78._4_4_ = auVar146._4_4_ * auVar24._4_4_;
            auVar78._0_4_ = auVar146._0_4_ * auVar24._0_4_;
            auVar78._8_4_ = auVar146._8_4_ * auVar24._8_4_;
            auVar78._12_4_ = auVar146._12_4_ * auVar24._12_4_;
            auVar78._16_4_ = auVar146._16_4_ * auVar24._16_4_;
            auVar78._20_4_ = auVar146._20_4_ * auVar24._20_4_;
            auVar78._24_4_ = auVar146._24_4_ * auVar24._24_4_;
            auVar78._28_4_ = auVar24._28_4_;
            auVar155 = vfmsub231ps_fma(auVar78,auVar23,auVar200);
            auVar215 = ZEXT1664(auVar155);
            auVar125 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar123),ZEXT1632(auVar155));
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT1632(auVar122),auVar126);
            auVar10 = vrcpps_avx(ZEXT1632(auVar19));
            auVar224._8_4_ = 0x3f800000;
            auVar224._0_8_ = 0x3f8000003f800000;
            auVar224._12_4_ = 0x3f800000;
            auVar224._16_4_ = 0x3f800000;
            auVar224._20_4_ = 0x3f800000;
            auVar224._24_4_ = 0x3f800000;
            auVar224._28_4_ = 0x3f800000;
            auVar225 = ZEXT3264(auVar224);
            auVar125 = vfnmadd213ps_fma(auVar10,ZEXT1632(auVar19),auVar224);
            auVar125 = vfmadd132ps_fma(ZEXT1632(auVar125),auVar10,auVar10);
            auVar79._4_4_ = auVar155._4_4_ * local_780._4_4_;
            auVar79._0_4_ = auVar155._0_4_ * local_780._0_4_;
            auVar79._8_4_ = auVar155._8_4_ * local_780._8_4_;
            auVar79._12_4_ = auVar155._12_4_ * local_780._12_4_;
            auVar79._16_4_ = local_780._16_4_ * 0.0;
            auVar79._20_4_ = local_780._20_4_ * 0.0;
            auVar79._24_4_ = local_780._24_4_ * 0.0;
            auVar79._28_4_ = auVar21._28_4_;
            auVar123 = vfmadd231ps_fma(auVar79,auVar149,ZEXT1632(auVar123));
            auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT1632(auVar122),local_760);
            fVar216 = auVar125._0_4_;
            fVar217 = auVar125._4_4_;
            fVar218 = auVar125._8_4_;
            fVar219 = auVar125._12_4_;
            auVar126 = ZEXT1632(CONCAT412(fVar219 * auVar123._12_4_,
                                          CONCAT48(fVar218 * auVar123._8_4_,
                                                   CONCAT44(fVar217 * auVar123._4_4_,
                                                            fVar216 * auVar123._0_4_))));
            fVar211 = (ray->super_RayK<1>).tfar;
            auVar173._4_4_ = fVar211;
            auVar173._0_4_ = fVar211;
            auVar173._8_4_ = fVar211;
            auVar173._12_4_ = fVar211;
            auVar173._16_4_ = fVar211;
            auVar173._20_4_ = fVar211;
            auVar173._24_4_ = fVar211;
            auVar173._28_4_ = fVar211;
            auVar149 = vcmpps_avx(local_380,auVar126,2);
            auVar10 = vcmpps_avx(auVar126,auVar173,2);
            auVar149 = vandps_avx(auVar10,auVar149);
            auVar125 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
            auVar20 = vpand_avx(auVar20,auVar125);
            auVar149 = vpmovsxwd_avx2(auVar20);
            if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar149 >> 0x7f,0) == '\0') &&
                  (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar149 >> 0xbf,0) == '\0') &&
                (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar149[0x1f]) goto LAB_01614d13;
            auVar149 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,4);
            auVar125 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
            auVar20 = vpand_avx(auVar20,auVar125);
            auVar149 = vpmovsxwd_avx2(auVar20);
            auVar174._8_8_ = local_500[1]._8_8_;
            auVar174._0_8_ = local_500[1]._0_8_;
            auVar174._16_8_ = local_500[1]._16_8_;
            auVar174._24_8_ = local_500[1]._24_8_;
            if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar149 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar149 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar149 >> 0x7f,0) != '\0') ||
                  (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar149 >> 0xbf,0) != '\0') ||
                (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar149[0x1f] < '\0') {
              auVar133 = ZEXT1632(CONCAT412(fVar219 * auVar17._12_4_,
                                            CONCAT48(fVar218 * auVar17._8_4_,
                                                     CONCAT44(fVar217 * auVar17._4_4_,
                                                              fVar216 * auVar17._0_4_))));
              auVar80._28_4_ = SUB84(local_500[1]._24_8_,4);
              auVar80._0_28_ =
                   ZEXT1628(CONCAT412(fVar219 * auVar18._12_4_,
                                      CONCAT48(fVar218 * auVar18._8_4_,
                                               CONCAT44(fVar217 * auVar18._4_4_,
                                                        fVar216 * auVar18._0_4_))));
              auVar201._8_4_ = 0x3f800000;
              auVar201._0_8_ = 0x3f8000003f800000;
              auVar201._12_4_ = 0x3f800000;
              auVar201._16_4_ = 0x3f800000;
              auVar201._20_4_ = 0x3f800000;
              auVar201._24_4_ = 0x3f800000;
              auVar201._28_4_ = 0x3f800000;
              auVar10 = vsubps_avx(auVar201,auVar133);
              local_100 = vblendvps_avx(auVar10,auVar133,auVar15);
              auVar10 = vsubps_avx(auVar201,auVar80);
              local_400 = vblendvps_avx(auVar10,auVar80,auVar15);
              local_3e0 = auVar126;
              auVar174 = auVar149;
            }
          }
          auVar233 = ZEXT3264(local_680);
          if ((((((((auVar174 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar174 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar174 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar174 >> 0x7f,0) == '\0') &&
                (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar174 >> 0xbf,0) == '\0') &&
              (auVar174 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar174[0x1f]) {
            auVar154 = ZEXT3264(local_580);
            auVar202 = ZEXT3264(local_660);
            goto LAB_01614cdd;
          }
          auVar149 = vsubps_avx(ZEXT1632(auVar16),local_460);
          auVar20 = vfmadd213ps_fma(auVar149,local_100,local_460);
          fVar211 = pre->depth_scale;
          auVar81._4_4_ = (auVar20._4_4_ + auVar20._4_4_) * fVar211;
          auVar81._0_4_ = (auVar20._0_4_ + auVar20._0_4_) * fVar211;
          auVar81._8_4_ = (auVar20._8_4_ + auVar20._8_4_) * fVar211;
          auVar81._12_4_ = (auVar20._12_4_ + auVar20._12_4_) * fVar211;
          auVar81._16_4_ = fVar211 * 0.0;
          auVar81._20_4_ = fVar211 * 0.0;
          auVar81._24_4_ = fVar211 * 0.0;
          auVar81._28_4_ = fVar211;
          auVar149 = vcmpps_avx(local_3e0,auVar81,6);
          auVar10 = auVar174 & auVar149;
          auVar202 = ZEXT3264(local_660);
          if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar10 >> 0x7f,0) != '\0') ||
                (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar10 >> 0xbf,0) != '\0') ||
              (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar10[0x1f] < '\0') {
            auVar150._8_4_ = 0xbf800000;
            auVar150._0_8_ = 0xbf800000bf800000;
            auVar150._12_4_ = 0xbf800000;
            auVar150._16_4_ = 0xbf800000;
            auVar150._20_4_ = 0xbf800000;
            auVar150._24_4_ = 0xbf800000;
            auVar150._28_4_ = 0xbf800000;
            auVar165._8_4_ = 0x40000000;
            auVar165._0_8_ = 0x4000000040000000;
            auVar165._12_4_ = 0x40000000;
            auVar165._16_4_ = 0x40000000;
            auVar165._20_4_ = 0x40000000;
            auVar165._24_4_ = 0x40000000;
            auVar165._28_4_ = 0x40000000;
            auVar20 = vfmadd213ps_fma(local_400,auVar165,auVar150);
            local_2a0 = local_100;
            local_400 = ZEXT1632(auVar20);
            auVar10 = local_400;
            local_280 = ZEXT1632(auVar20);
            local_260 = local_3e0;
            local_23c = iVar13;
            local_230 = local_6d0;
            uStack_228 = uStack_6c8;
            local_220 = local_6e0;
            uStack_218 = uStack_6d8;
            local_210 = local_6f0;
            uStack_208 = uStack_6e8;
            local_200 = CONCAT44(fStack_6fc,local_700);
            uStack_1f8 = CONCAT44(fStack_6f4,fStack_6f8);
            pGVar115 = (context->scene->geometries).items[local_788].ptr;
            local_400 = auVar10;
            if ((pGVar115->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar149 = vandps_avx(auVar149,auVar174);
              local_500[0] = auVar149;
              fVar211 = (float)local_240;
              local_1c0[0] = (fVar211 + local_100._0_4_ + 0.0) * local_120;
              local_1c0[1] = (fVar211 + local_100._4_4_ + 1.0) * fStack_11c;
              local_1c0[2] = (fVar211 + local_100._8_4_ + 2.0) * fStack_118;
              local_1c0[3] = (fVar211 + local_100._12_4_ + 3.0) * fStack_114;
              fStack_1b0 = (fVar211 + local_100._16_4_ + 4.0) * fStack_110;
              fStack_1ac = (fVar211 + local_100._20_4_ + 5.0) * fStack_10c;
              fStack_1a8 = (fVar211 + local_100._24_4_ + 6.0) * fStack_108;
              fStack_1a4 = fVar211 + local_100._28_4_ + 7.0;
              local_400._0_8_ = auVar20._0_8_;
              local_400._8_8_ = auVar20._8_8_;
              local_1a0 = local_400._0_8_;
              uStack_198 = local_400._8_8_;
              uStack_190 = 0;
              uStack_188 = 0;
              local_180 = local_3e0;
              auVar151._8_4_ = 0x7f800000;
              auVar151._0_8_ = 0x7f8000007f800000;
              auVar151._12_4_ = 0x7f800000;
              auVar151._16_4_ = 0x7f800000;
              auVar151._20_4_ = 0x7f800000;
              auVar151._24_4_ = 0x7f800000;
              auVar151._28_4_ = 0x7f800000;
              auVar10 = vblendvps_avx(auVar151,local_3e0,auVar149);
              auVar126 = vshufps_avx(auVar10,auVar10,0xb1);
              auVar126 = vminps_avx(auVar10,auVar126);
              auVar133 = vshufpd_avx(auVar126,auVar126,5);
              auVar126 = vminps_avx(auVar126,auVar133);
              auVar133 = vpermpd_avx2(auVar126,0x4e);
              auVar126 = vminps_avx(auVar126,auVar133);
              auVar10 = vcmpps_avx(auVar10,auVar126,0);
              auVar126 = auVar149 & auVar10;
              if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar126 >> 0x7f,0) != '\0') ||
                    (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar126 >> 0xbf,0) != '\0') ||
                  (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar126[0x1f] < '\0') {
                auVar149 = vandps_avx(auVar10,auVar149);
              }
              uVar112 = vmovmskps_avx(auVar149);
              uVar110 = 0;
              for (; (uVar112 & 1) == 0; uVar112 = uVar112 >> 1 | 0x80000000) {
                uVar110 = uVar110 + 1;
              }
              uVar113 = (ulong)uVar110;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar115->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_760 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_780._0_8_ = pGVar115;
                do {
                  local_5c4 = local_1c0[uVar113];
                  local_5c0 = *(undefined4 *)((long)&local_1a0 + uVar113 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar113 * 4);
                  fVar211 = 1.0 - local_5c4;
                  auVar125 = ZEXT416((uint)local_5c4);
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,
                                            ZEXT416(0xc0a00000));
                  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_5c4 * local_5c4 * 3.0)),
                                            ZEXT416((uint)(local_5c4 + local_5c4)),auVar20);
                  auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,
                                            ZEXT416(0x40000000));
                  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211 * -3.0)),
                                            ZEXT416((uint)(fVar211 + fVar211)),auVar20);
                  auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(local_5c4 * (fVar211 + fVar211))),
                                             ZEXT416((uint)fVar211),ZEXT416((uint)fVar211));
                  auVar125 = vfmadd231ss_fma(ZEXT416((uint)(local_5c4 * local_5c4)),auVar125,
                                             ZEXT416((uint)(fVar211 * -2.0)));
                  fVar211 = auVar20._0_4_ * 0.5;
                  fVar216 = auVar125._0_4_ * 0.5;
                  auVar178._0_4_ = fVar216 * local_700;
                  auVar178._4_4_ = fVar216 * fStack_6fc;
                  auVar178._8_4_ = fVar216 * fStack_6f8;
                  auVar178._12_4_ = fVar216 * fStack_6f4;
                  auVar158._4_4_ = fVar211;
                  auVar158._0_4_ = fVar211;
                  auVar158._8_4_ = fVar211;
                  auVar158._12_4_ = fVar211;
                  auVar99._8_8_ = uStack_6e8;
                  auVar99._0_8_ = local_6f0;
                  auVar20 = vfmadd132ps_fma(auVar158,auVar178,auVar99);
                  fVar211 = auVar16._0_4_ * 0.5;
                  auVar179._4_4_ = fVar211;
                  auVar179._0_4_ = fVar211;
                  auVar179._8_4_ = fVar211;
                  auVar179._12_4_ = fVar211;
                  auVar102._8_8_ = uStack_6d8;
                  auVar102._0_8_ = local_6e0;
                  auVar20 = vfmadd132ps_fma(auVar179,auVar20,auVar102);
                  fVar211 = auVar17._0_4_ * 0.5;
                  auVar159._4_4_ = fVar211;
                  auVar159._0_4_ = fVar211;
                  auVar159._8_4_ = fVar211;
                  auVar159._12_4_ = fVar211;
                  auVar105._8_8_ = uStack_6c8;
                  auVar105._0_8_ = local_6d0;
                  auVar20 = vfmadd132ps_fma(auVar159,auVar20,auVar105);
                  local_6b0.context = context->user;
                  local_5d0 = vmovlps_avx(auVar20);
                  local_5c8 = vextractps_avx(auVar20,2);
                  local_5bc = (int)local_728;
                  local_5b8 = (int)local_788;
                  local_5b4 = (local_6b0.context)->instID[0];
                  local_5b0 = (local_6b0.context)->instPrimID[0];
                  local_78c = -1;
                  local_6b0.valid = &local_78c;
                  local_6b0.geometryUserPtr = pGVar115->userPtr;
                  local_6b0.ray = (RTCRayN *)ray;
                  local_6b0.hit = (RTCHitN *)&local_5d0;
                  local_6b0.N = 1;
                  local_720._0_8_ = uVar113;
                  if (pGVar115->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01614f15:
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar115->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar215 = ZEXT1664(auVar215._0_16_);
                      auVar225 = ZEXT1664(auVar225._0_16_);
                      (*p_Var14)(&local_6b0);
                      pGVar115 = (Geometry *)local_780._0_8_;
                      uVar113 = local_720._0_8_;
                      if (*local_6b0.valid == 0) goto LAB_01614fbc;
                    }
                    (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).components[0] =
                         *(float *)local_6b0.hit;
                    (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_6b0.hit + 4);
                    (((Vec3f *)((long)local_6b0.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_6b0.hit + 8);
                    *(float *)((long)local_6b0.ray + 0x3c) = *(float *)(local_6b0.hit + 0xc);
                    *(float *)((long)local_6b0.ray + 0x40) = *(float *)(local_6b0.hit + 0x10);
                    *(float *)((long)local_6b0.ray + 0x44) = *(float *)(local_6b0.hit + 0x14);
                    *(float *)((long)local_6b0.ray + 0x48) = *(float *)(local_6b0.hit + 0x18);
                    *(float *)((long)local_6b0.ray + 0x4c) = *(float *)(local_6b0.hit + 0x1c);
                    *(float *)((long)local_6b0.ray + 0x50) = *(float *)(local_6b0.hit + 0x20);
                  }
                  else {
                    auVar215 = ZEXT1664(auVar215._0_16_);
                    auVar225 = ZEXT1664(auVar225._0_16_);
                    (*pGVar115->intersectionFilterN)(&local_6b0);
                    pGVar115 = (Geometry *)local_780._0_8_;
                    uVar113 = local_720._0_8_;
                    if (*local_6b0.valid != 0) goto LAB_01614f15;
LAB_01614fbc:
                    (ray->super_RayK<1>).tfar = (float)local_760._0_4_;
                    pGVar115 = (Geometry *)local_780._0_8_;
                    uVar113 = local_720._0_8_;
                  }
                  *(undefined4 *)(local_500[0] + uVar113 * 4) = 0;
                  auVar126 = local_500[0];
                  fVar211 = (ray->super_RayK<1>).tfar;
                  auVar134._4_4_ = fVar211;
                  auVar134._0_4_ = fVar211;
                  auVar134._8_4_ = fVar211;
                  auVar134._12_4_ = fVar211;
                  auVar134._16_4_ = fVar211;
                  auVar134._20_4_ = fVar211;
                  auVar134._24_4_ = fVar211;
                  auVar134._28_4_ = fVar211;
                  auVar10 = vcmpps_avx(local_3e0,auVar134,2);
                  auVar149 = vandps_avx(auVar10,local_500[0]);
                  local_500[0] = auVar149;
                  auVar126 = auVar126 & auVar10;
                  if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar126 >> 0x7f,0) == '\0') &&
                        (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar126 >> 0xbf,0) == '\0') &&
                      (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar126[0x1f]) goto LAB_01615058;
                  auVar152._8_4_ = 0x7f800000;
                  auVar152._0_8_ = 0x7f8000007f800000;
                  auVar152._12_4_ = 0x7f800000;
                  auVar152._16_4_ = 0x7f800000;
                  auVar152._20_4_ = 0x7f800000;
                  auVar152._24_4_ = 0x7f800000;
                  auVar152._28_4_ = 0x7f800000;
                  auVar10 = vblendvps_avx(auVar152,local_3e0,auVar149);
                  auVar126 = vshufps_avx(auVar10,auVar10,0xb1);
                  auVar126 = vminps_avx(auVar10,auVar126);
                  auVar133 = vshufpd_avx(auVar126,auVar126,5);
                  auVar126 = vminps_avx(auVar126,auVar133);
                  auVar133 = vpermpd_avx2(auVar126,0x4e);
                  auVar126 = vminps_avx(auVar126,auVar133);
                  auVar10 = vcmpps_avx(auVar10,auVar126,0);
                  auVar126 = auVar149 & auVar10;
                  if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar126 >> 0x7f,0) != '\0') ||
                        (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar126 >> 0xbf,0) != '\0') ||
                      (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar126[0x1f] < '\0') {
                    auVar149 = vandps_avx(auVar10,auVar149);
                  }
                  local_760 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  uVar112 = vmovmskps_avx(auVar149);
                  uVar110 = 0;
                  for (; (uVar112 & 1) == 0; uVar112 = uVar112 >> 1 | 0x80000000) {
                    uVar110 = uVar110 + 1;
                  }
                  uVar113 = (ulong)uVar110;
                } while( true );
              }
              fVar211 = local_1c0[uVar113];
              fVar216 = 1.0 - fVar211;
              auVar125 = ZEXT416((uint)fVar211);
              auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,ZEXT416(0xc0a00000))
              ;
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211 * 3.0)),
                                        ZEXT416((uint)(fVar211 + fVar211)),auVar20);
              auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar125,ZEXT416(0x40000000))
              ;
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar216 * -3.0)),
                                        ZEXT416((uint)(fVar216 + fVar216)),auVar20);
              auVar17 = vfnmadd231ss_fma(ZEXT416((uint)(fVar211 * (fVar216 + fVar216))),
                                         ZEXT416((uint)fVar216),ZEXT416((uint)fVar216));
              auVar125 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211)),auVar125,
                                         ZEXT416((uint)(fVar216 * -2.0)));
              fVar216 = auVar20._0_4_ * 0.5;
              fVar217 = auVar125._0_4_ * 0.5;
              auVar170._0_4_ = fVar217 * local_700;
              auVar170._4_4_ = fVar217 * fStack_6fc;
              auVar170._8_4_ = fVar217 * fStack_6f8;
              auVar170._12_4_ = fVar217 * fStack_6f4;
              auVar141._4_4_ = fVar216;
              auVar141._0_4_ = fVar216;
              auVar141._8_4_ = fVar216;
              auVar141._12_4_ = fVar216;
              auVar98._8_8_ = uStack_6e8;
              auVar98._0_8_ = local_6f0;
              auVar20 = vfmadd132ps_fma(auVar141,auVar170,auVar98);
              fVar216 = auVar16._0_4_ * 0.5;
              auVar171._4_4_ = fVar216;
              auVar171._0_4_ = fVar216;
              auVar171._8_4_ = fVar216;
              auVar171._12_4_ = fVar216;
              auVar101._8_8_ = uStack_6d8;
              auVar101._0_8_ = local_6e0;
              auVar20 = vfmadd132ps_fma(auVar171,auVar20,auVar101);
              fVar216 = *(float *)((long)&local_1a0 + uVar113 * 4);
              fVar217 = auVar17._0_4_ * 0.5;
              auVar157._4_4_ = fVar217;
              auVar157._0_4_ = fVar217;
              auVar157._8_4_ = fVar217;
              auVar157._12_4_ = fVar217;
              auVar104._8_8_ = uStack_6c8;
              auVar104._0_8_ = local_6d0;
              auVar20 = vfmadd132ps_fma(auVar157,auVar20,auVar104);
              (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar113 * 4);
              uVar119 = vmovlps_avx(auVar20);
              *(undefined8 *)&(ray->Ng).field_0 = uVar119;
              fVar217 = (float)vextractps_avx(auVar20,2);
              (ray->Ng).field_0.field_0.z = fVar217;
              ray->u = fVar211;
              ray->v = fVar216;
              ray->primID = (uint)local_728;
              ray->geomID = (uint)local_788;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              prim = local_6c0;
            }
          }
          goto LAB_01614cd4;
        }
        auVar154 = ZEXT3264(local_580);
        auVar202 = ZEXT3264(local_660);
        auVar233 = ZEXT3264(local_680);
        goto LAB_01614cdd;
      }
LAB_01613ed6:
      fVar211 = (ray->super_RayK<1>).tfar;
      auVar124._4_4_ = fVar211;
      auVar124._0_4_ = fVar211;
      auVar124._8_4_ = fVar211;
      auVar124._12_4_ = fVar211;
      auVar20 = vcmpps_avx(local_2c0,auVar124,2);
      uVar110 = vmovmskps_avx(auVar20);
      uVar110 = (uint)uVar116 & uVar110;
    } while (uVar110 != 0);
  }
  return;
LAB_01615058:
  auVar202 = ZEXT3264(local_660);
  auVar233 = ZEXT3264(local_680);
  prim = local_6c0;
  pre = local_6b8;
LAB_01614cd4:
  auVar154 = ZEXT3264(local_580);
LAB_01614cdd:
  lVar117 = lVar117 + 8;
  auVar11._8_8_ = uStack_498;
  auVar11._0_8_ = local_4a0;
  auVar11._16_8_ = uStack_490;
  auVar11._24_8_ = uStack_488;
  auVar175 = ZEXT3264(local_520);
  if (iVar13 <= (int)lVar117) goto LAB_01613ed6;
  goto LAB_0161423c;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }